

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_h<embree::sse2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  RTCRayQueryFlags *pRVar3;
  float *pfVar4;
  RTCRayQueryFlags *pRVar5;
  Primitive *pPVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Primitive PVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined6 uVar36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  int iVar58;
  undefined4 uVar59;
  ulong uVar60;
  undefined4 uVar65;
  undefined1 (*pauVar61) [16];
  long lVar62;
  RTCFilterFunctionN p_Var63;
  undefined8 uVar64;
  RTCIntersectArguments *pRVar66;
  RTCIntersectArguments *pRVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  bool bVar71;
  int iVar72;
  ulong uVar73;
  bool bVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  short sVar80;
  undefined2 uVar121;
  float fVar81;
  float fVar122;
  float fVar123;
  __m128 a_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float pp;
  float fVar124;
  float fVar152;
  float fVar153;
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar166;
  float fVar167;
  vfloat4 v;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  float fVar183;
  float fVar184;
  vfloat4 v_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar194;
  float fVar195;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  float fVar196;
  float fVar222;
  float fVar223;
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  float fVar224;
  undefined1 auVar225 [8];
  float fVar238;
  float fVar239;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar253;
  float fVar254;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar258;
  float fVar259;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar260;
  float fVar272;
  float fVar273;
  undefined1 auVar261 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar274;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar275 [16];
  undefined1 auVar278 [16];
  float fVar282;
  float fVar283;
  float fVar292;
  float fVar294;
  vfloat4 a;
  float fVar296;
  undefined1 auVar285 [16];
  float fVar284;
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  float fVar293;
  float fVar295;
  float fVar297;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar298;
  float fVar305;
  float fVar306;
  __m128 a_2;
  float fVar308;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [16];
  float fVar307;
  float fVar309;
  undefined1 auVar304 [16];
  float fVar310;
  float fVar311;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar323 [8];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  RTCFilterFunctionNArguments args;
  vfloat<4> Oz;
  vfloatx vu0;
  vfloat<4> A;
  vfloat<4> rl;
  BBox<embree::vfloat_impl<4>_> tp1;
  vfloat<4> dOz;
  vfloat<4> B;
  vfloat<4> dOdO;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined4 local_53c;
  RTCFilterFunctionNArguments local_538;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  float fStack_4a0;
  float fStack_49c;
  undefined4 local_498;
  undefined4 local_494;
  uint local_490;
  uint local_48c;
  uint local_488;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  ulong local_388;
  RayQueryContext *local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  Primitive *local_2e8;
  ulong local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 uVar120;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar220 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar330 [16];
  
  PVar15 = prim[1];
  uVar60 = (ulong)(byte)PVar15;
  lVar21 = uVar60 * 0x25;
  pPVar6 = prim + lVar21 + 6;
  fVar167 = *(float *)(pPVar6 + 0xc);
  fVar168 = ((ray->org).field_0.m128[0] - *(float *)pPVar6) * fVar167;
  fVar183 = ((ray->org).field_0.m128[1] - *(float *)(pPVar6 + 4)) * fVar167;
  fVar184 = ((ray->org).field_0.m128[2] - *(float *)(pPVar6 + 8)) * fVar167;
  fVar154 = fVar167 * (ray->dir).field_0.m128[0];
  fVar166 = fVar167 * (ray->dir).field_0.m128[1];
  fVar167 = fVar167 * (ray->dir).field_0.m128[2];
  uVar59 = *(undefined4 *)(prim + uVar60 * 4 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar73;
  auVar82._12_2_ = uVar121;
  auVar82._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar156._12_4_ = auVar82._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar73;
  auVar156._10_2_ = uVar121;
  auVar265._10_6_ = auVar156._10_6_;
  auVar265._8_2_ = uVar121;
  auVar265._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar37._4_8_ = auVar265._8_8_;
  auVar37._2_2_ = uVar121;
  auVar37._0_2_ = uVar121;
  fVar310 = (float)((int)sVar80 >> 8);
  fVar316 = (float)(auVar37._0_4_ >> 0x18);
  fVar317 = (float)(auVar265._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 5 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar73;
  auVar127._12_2_ = uVar121;
  auVar127._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar73;
  auVar126._10_2_ = uVar121;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._8_2_ = uVar121;
  auVar125._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar38._4_8_ = auVar125._8_8_;
  auVar38._2_2_ = uVar121;
  auVar38._0_2_ = uVar121;
  fVar185 = (float)((int)sVar80 >> 8);
  fVar194 = (float)(auVar38._0_4_ >> 0x18);
  fVar195 = (float)(auVar125._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 6 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar130._8_4_ = 0;
  auVar130._0_8_ = uVar73;
  auVar130._12_2_ = uVar121;
  auVar130._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar129._12_4_ = auVar130._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar73;
  auVar129._10_2_ = uVar121;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._8_2_ = uVar121;
  auVar128._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar39._4_8_ = auVar128._8_8_;
  auVar39._2_2_ = uVar121;
  auVar39._0_2_ = uVar121;
  fVar224 = (float)((int)sVar80 >> 8);
  fVar238 = (float)(auVar39._0_4_ >> 0x18);
  fVar239 = (float)(auVar128._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0xf + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar73;
  auVar133._12_2_ = uVar121;
  auVar133._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar73;
  auVar132._10_2_ = uVar121;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = uVar121;
  auVar131._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar40._4_8_ = auVar131._8_8_;
  auVar40._2_2_ = uVar121;
  auVar40._0_2_ = uVar121;
  fVar81 = (float)((int)sVar80 >> 8);
  fVar122 = (float)(auVar40._0_4_ >> 0x18);
  fVar123 = (float)(auVar131._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + (ulong)(byte)PVar15 * 0x10 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar73;
  auVar199._12_2_ = uVar121;
  auVar199._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar73;
  auVar198._10_2_ = uVar121;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar121;
  auVar197._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar41._4_8_ = auVar197._8_8_;
  auVar41._2_2_ = uVar121;
  auVar41._0_2_ = uVar121;
  fVar240 = (float)((int)sVar80 >> 8);
  fVar253 = (float)(auVar41._0_4_ >> 0x18);
  fVar254 = (float)(auVar197._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + (ulong)(byte)PVar15 * 0x10 + uVar60 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar73;
  auVar202._12_2_ = uVar121;
  auVar202._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar73;
  auVar201._10_2_ = uVar121;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar121;
  auVar200._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar42._4_8_ = auVar200._8_8_;
  auVar42._2_2_ = uVar121;
  auVar42._0_2_ = uVar121;
  fVar260 = (float)((int)sVar80 >> 8);
  fVar272 = (float)(auVar42._0_4_ >> 0x18);
  fVar273 = (float)(auVar200._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0x1a + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar73;
  auVar205._12_2_ = uVar121;
  auVar205._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar73;
  auVar204._10_2_ = uVar121;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar121;
  auVar203._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar43._4_8_ = auVar203._8_8_;
  auVar43._2_2_ = uVar121;
  auVar43._0_2_ = uVar121;
  fVar255 = (float)((int)sVar80 >> 8);
  fVar258 = (float)(auVar43._0_4_ >> 0x18);
  fVar259 = (float)(auVar203._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0x1b + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar73;
  auVar208._12_2_ = uVar121;
  auVar208._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar73;
  auVar207._10_2_ = uVar121;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar121;
  auVar206._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar44._4_8_ = auVar206._8_8_;
  auVar44._2_2_ = uVar121;
  auVar44._0_2_ = uVar121;
  fVar274 = (float)((int)sVar80 >> 8);
  fVar279 = (float)(auVar44._0_4_ >> 0x18);
  fVar280 = (float)(auVar206._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0x1c + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar64 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar64 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar73 = CONCAT62(uVar36,sVar80);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar73;
  auVar211._12_2_ = uVar121;
  auVar211._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar64 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar73;
  auVar210._10_2_ = uVar121;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar121;
  auVar209._0_8_ = uVar73;
  uVar121 = (undefined2)uVar36;
  auVar45._4_8_ = auVar209._8_8_;
  auVar45._2_2_ = uVar121;
  auVar45._0_2_ = uVar121;
  fVar124 = (float)((int)sVar80 >> 8);
  fVar152 = (float)(auVar45._0_4_ >> 0x18);
  fVar153 = (float)(auVar209._8_4_ >> 0x18);
  fVar298 = fVar154 * fVar310 + fVar166 * fVar185 + fVar167 * fVar224;
  fVar305 = fVar154 * fVar316 + fVar166 * fVar194 + fVar167 * fVar238;
  fVar306 = fVar154 * fVar317 + fVar166 * fVar195 + fVar167 * fVar239;
  fVar308 = fVar154 * (float)(auVar156._12_4_ >> 0x18) +
            fVar166 * (float)(auVar126._12_4_ >> 0x18) + fVar167 * (float)(auVar129._12_4_ >> 0x18);
  fVar283 = fVar154 * fVar81 + fVar166 * fVar240 + fVar167 * fVar260;
  fVar292 = fVar154 * fVar122 + fVar166 * fVar253 + fVar167 * fVar272;
  fVar294 = fVar154 * fVar123 + fVar166 * fVar254 + fVar167 * fVar273;
  fVar296 = fVar154 * (float)(auVar132._12_4_ >> 0x18) +
            fVar166 * (float)(auVar198._12_4_ >> 0x18) + fVar167 * (float)(auVar201._12_4_ >> 0x18);
  fVar196 = fVar154 * fVar255 + fVar166 * fVar274 + fVar167 * fVar124;
  fVar222 = fVar154 * fVar258 + fVar166 * fVar279 + fVar167 * fVar152;
  fVar223 = fVar154 * fVar259 + fVar166 * fVar280 + fVar167 * fVar153;
  fVar154 = fVar154 * (float)(auVar204._12_4_ >> 0x18) +
            fVar166 * (float)(auVar207._12_4_ >> 0x18) + fVar167 * (float)(auVar210._12_4_ >> 0x18);
  fVar311 = fVar310 * fVar168 + fVar185 * fVar183 + fVar224 * fVar184;
  fVar316 = fVar316 * fVar168 + fVar194 * fVar183 + fVar238 * fVar184;
  fVar317 = fVar317 * fVar168 + fVar195 * fVar183 + fVar239 * fVar184;
  fVar318 = (float)(auVar156._12_4_ >> 0x18) * fVar168 +
            (float)(auVar126._12_4_ >> 0x18) * fVar183 + (float)(auVar129._12_4_ >> 0x18) * fVar184;
  fVar260 = fVar81 * fVar168 + fVar240 * fVar183 + fVar260 * fVar184;
  fVar272 = fVar122 * fVar168 + fVar253 * fVar183 + fVar272 * fVar184;
  fVar273 = fVar123 * fVar168 + fVar254 * fVar183 + fVar273 * fVar184;
  fVar310 = (float)(auVar132._12_4_ >> 0x18) * fVar168 +
            (float)(auVar198._12_4_ >> 0x18) * fVar183 + (float)(auVar201._12_4_ >> 0x18) * fVar184;
  fVar255 = fVar168 * fVar255 + fVar183 * fVar274 + fVar184 * fVar124;
  fVar258 = fVar168 * fVar258 + fVar183 * fVar279 + fVar184 * fVar152;
  fVar259 = fVar168 * fVar259 + fVar183 * fVar280 + fVar184 * fVar153;
  fVar274 = fVar168 * (float)(auVar204._12_4_ >> 0x18) +
            fVar183 * (float)(auVar207._12_4_ >> 0x18) + fVar184 * (float)(auVar210._12_4_ >> 0x18);
  fVar167 = (float)DAT_01f80d30;
  fVar81 = DAT_01f80d30._4_4_;
  fVar122 = DAT_01f80d30._8_4_;
  fVar123 = DAT_01f80d30._12_4_;
  uVar75 = -(uint)(fVar167 <= ABS(fVar298));
  uVar76 = -(uint)(fVar81 <= ABS(fVar305));
  uVar77 = -(uint)(fVar122 <= ABS(fVar306));
  uVar78 = -(uint)(fVar123 <= ABS(fVar308));
  auVar299._0_4_ = (uint)fVar298 & uVar75;
  auVar299._4_4_ = (uint)fVar305 & uVar76;
  auVar299._8_4_ = (uint)fVar306 & uVar77;
  auVar299._12_4_ = (uint)fVar308 & uVar78;
  auVar169._0_4_ = ~uVar75 & (uint)fVar167;
  auVar169._4_4_ = ~uVar76 & (uint)fVar81;
  auVar169._8_4_ = ~uVar77 & (uint)fVar122;
  auVar169._12_4_ = ~uVar78 & (uint)fVar123;
  auVar169 = auVar169 | auVar299;
  uVar75 = -(uint)(fVar167 <= ABS(fVar283));
  uVar76 = -(uint)(fVar81 <= ABS(fVar292));
  uVar77 = -(uint)(fVar122 <= ABS(fVar294));
  uVar78 = -(uint)(fVar123 <= ABS(fVar296));
  auVar285._0_4_ = (uint)fVar283 & uVar75;
  auVar285._4_4_ = (uint)fVar292 & uVar76;
  auVar285._8_4_ = (uint)fVar294 & uVar77;
  auVar285._12_4_ = (uint)fVar296 & uVar78;
  auVar226._0_4_ = ~uVar75 & (uint)fVar167;
  auVar226._4_4_ = ~uVar76 & (uint)fVar81;
  auVar226._8_4_ = ~uVar77 & (uint)fVar122;
  auVar226._12_4_ = ~uVar78 & (uint)fVar123;
  auVar226 = auVar226 | auVar285;
  uVar75 = -(uint)(fVar167 <= ABS(fVar196));
  uVar76 = -(uint)(fVar81 <= ABS(fVar222));
  uVar77 = -(uint)(fVar122 <= ABS(fVar223));
  uVar78 = -(uint)(fVar123 <= ABS(fVar154));
  auVar212._0_4_ = (uint)fVar196 & uVar75;
  auVar212._4_4_ = (uint)fVar222 & uVar76;
  auVar212._8_4_ = (uint)fVar223 & uVar77;
  auVar212._12_4_ = (uint)fVar154 & uVar78;
  auVar241._0_4_ = ~uVar75 & (uint)fVar167;
  auVar241._4_4_ = ~uVar76 & (uint)fVar81;
  auVar241._8_4_ = ~uVar77 & (uint)fVar122;
  auVar241._12_4_ = ~uVar78 & (uint)fVar123;
  auVar241 = auVar241 | auVar212;
  auVar82 = rcpps(_DAT_01f80d30,auVar169);
  fVar167 = auVar82._0_4_;
  fVar123 = auVar82._4_4_;
  fVar185 = auVar82._8_4_;
  fVar240 = auVar82._12_4_;
  fVar167 = (1.0 - auVar169._0_4_ * fVar167) * fVar167 + fVar167;
  fVar123 = (1.0 - auVar169._4_4_ * fVar123) * fVar123 + fVar123;
  fVar185 = (1.0 - auVar169._8_4_ * fVar185) * fVar185 + fVar185;
  fVar240 = (1.0 - auVar169._12_4_ * fVar240) * fVar240 + fVar240;
  auVar82 = rcpps(auVar82,auVar226);
  fVar81 = auVar82._0_4_;
  fVar124 = auVar82._4_4_;
  fVar194 = auVar82._8_4_;
  fVar253 = auVar82._12_4_;
  fVar81 = (1.0 - auVar226._0_4_ * fVar81) * fVar81 + fVar81;
  fVar124 = (1.0 - auVar226._4_4_ * fVar124) * fVar124 + fVar124;
  fVar194 = (1.0 - auVar226._8_4_ * fVar194) * fVar194 + fVar194;
  fVar253 = (1.0 - auVar226._12_4_ * fVar253) * fVar253 + fVar253;
  auVar82 = rcpps(auVar82,auVar241);
  fVar122 = auVar82._0_4_;
  fVar152 = auVar82._4_4_;
  fVar195 = auVar82._8_4_;
  fVar254 = auVar82._12_4_;
  fVar122 = (1.0 - auVar241._0_4_ * fVar122) * fVar122 + fVar122;
  fVar152 = (1.0 - auVar241._4_4_ * fVar152) * fVar152 + fVar152;
  fVar195 = (1.0 - auVar241._8_4_ * fVar195) * fVar195 + fVar195;
  fVar254 = (1.0 - auVar241._12_4_ * fVar254) * fVar254 + fVar254;
  fVar279 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar21 + 0x16)) *
            *(float *)(prim + lVar21 + 0x1a);
  uVar73 = *(ulong *)(prim + uVar60 * 7 + 6);
  uVar121 = (undefined2)(uVar73 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar73;
  auVar83._12_2_ = uVar121;
  auVar83._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar73 >> 0x20);
  auVar291._12_4_ = auVar83._12_4_;
  auVar291._8_2_ = 0;
  auVar291._0_8_ = uVar73;
  auVar291._10_2_ = uVar121;
  auVar249._10_6_ = auVar291._10_6_;
  auVar249._8_2_ = uVar121;
  auVar249._0_8_ = uVar73;
  uVar121 = (undefined2)(uVar73 >> 0x10);
  auVar46._4_8_ = auVar249._8_8_;
  auVar46._2_2_ = uVar121;
  auVar46._0_2_ = uVar121;
  fVar153 = (float)(auVar46._0_4_ >> 0x10);
  fVar196 = (float)(auVar249._8_4_ >> 0x10);
  uVar68 = *(ulong *)(prim + uVar60 * 0xb + 6);
  uVar121 = (undefined2)(uVar68 >> 0x30);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar68;
  auVar172._12_2_ = uVar121;
  auVar172._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar68 >> 0x20);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar68;
  auVar171._10_2_ = uVar121;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = uVar121;
  auVar170._0_8_ = uVar68;
  uVar121 = (undefined2)(uVar68 >> 0x10);
  auVar47._4_8_ = auVar170._8_8_;
  auVar47._2_2_ = uVar121;
  auVar47._0_2_ = uVar121;
  uVar7 = *(ulong *)(prim + uVar60 * 9 + 6);
  uVar121 = (undefined2)(uVar7 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar7;
  auVar86._12_2_ = uVar121;
  auVar86._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar7 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar7;
  auVar85._10_2_ = uVar121;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar121;
  auVar84._0_8_ = uVar7;
  uVar121 = (undefined2)(uVar7 >> 0x10);
  auVar48._4_8_ = auVar84._8_8_;
  auVar48._2_2_ = uVar121;
  auVar48._0_2_ = uVar121;
  fVar154 = (float)(auVar48._0_4_ >> 0x10);
  fVar222 = (float)(auVar84._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar60 * 0xd + 6);
  uVar121 = (undefined2)(uVar8 >> 0x30);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar8;
  auVar244._12_2_ = uVar121;
  auVar244._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar8 >> 0x20);
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar8;
  auVar243._10_2_ = uVar121;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._8_2_ = uVar121;
  auVar242._0_8_ = uVar8;
  uVar121 = (undefined2)(uVar8 >> 0x10);
  auVar49._4_8_ = auVar242._8_8_;
  auVar49._2_2_ = uVar121;
  auVar49._0_2_ = uVar121;
  uVar9 = *(ulong *)(prim + uVar60 * 0x12 + 6);
  uVar121 = (undefined2)(uVar9 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar9;
  auVar89._12_2_ = uVar121;
  auVar89._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar9 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar9;
  auVar88._10_2_ = uVar121;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar121;
  auVar87._0_8_ = uVar9;
  uVar121 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar87._8_8_;
  auVar50._2_2_ = uVar121;
  auVar50._0_2_ = uVar121;
  fVar166 = (float)(auVar50._0_4_ >> 0x10);
  fVar223 = (float)(auVar87._8_4_ >> 0x10);
  uVar70 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  uVar10 = *(ulong *)(prim + uVar60 * 2 + uVar70 + 6);
  uVar121 = (undefined2)(uVar10 >> 0x30);
  auVar263._8_4_ = 0;
  auVar263._0_8_ = uVar10;
  auVar263._12_2_ = uVar121;
  auVar263._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar10 >> 0x20);
  auVar262._12_4_ = auVar263._12_4_;
  auVar262._8_2_ = 0;
  auVar262._0_8_ = uVar10;
  auVar262._10_2_ = uVar121;
  auVar261._10_6_ = auVar262._10_6_;
  auVar261._8_2_ = uVar121;
  auVar261._0_8_ = uVar10;
  uVar121 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar261._8_8_;
  auVar51._2_2_ = uVar121;
  auVar51._0_2_ = uVar121;
  uVar70 = *(ulong *)(prim + uVar70 + 6);
  uVar121 = (undefined2)(uVar70 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar70;
  auVar92._12_2_ = uVar121;
  auVar92._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar70 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar70;
  auVar91._10_2_ = uVar121;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar121;
  auVar90._0_8_ = uVar70;
  uVar121 = (undefined2)(uVar70 >> 0x10);
  auVar52._4_8_ = auVar90._8_8_;
  auVar52._2_2_ = uVar121;
  auVar52._0_2_ = uVar121;
  fVar168 = (float)(auVar52._0_4_ >> 0x10);
  fVar224 = (float)(auVar90._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar60 * 0x18 + 6);
  uVar121 = (undefined2)(uVar11 >> 0x30);
  auVar277._8_4_ = 0;
  auVar277._0_8_ = uVar11;
  auVar277._12_2_ = uVar121;
  auVar277._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar11 >> 0x20);
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._8_2_ = 0;
  auVar276._0_8_ = uVar11;
  auVar276._10_2_ = uVar121;
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._8_2_ = uVar121;
  auVar275._0_8_ = uVar11;
  uVar121 = (undefined2)(uVar11 >> 0x10);
  auVar53._4_8_ = auVar275._8_8_;
  auVar53._2_2_ = uVar121;
  auVar53._0_2_ = uVar121;
  uVar12 = *(ulong *)(prim + uVar60 * 0x1d + 6);
  uVar121 = (undefined2)(uVar12 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar12;
  auVar95._12_2_ = uVar121;
  auVar95._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar12 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar12;
  auVar94._10_2_ = uVar121;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar121;
  auVar93._0_8_ = uVar12;
  uVar121 = (undefined2)(uVar12 >> 0x10);
  auVar54._4_8_ = auVar93._8_8_;
  auVar54._2_2_ = uVar121;
  auVar54._0_2_ = uVar121;
  fVar183 = (float)(auVar54._0_4_ >> 0x10);
  fVar238 = (float)(auVar93._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar15 * 0x20 + 6);
  uVar121 = (undefined2)(uVar13 >> 0x30);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar13;
  auVar288._12_2_ = uVar121;
  auVar288._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar13 >> 0x20);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._8_2_ = 0;
  auVar287._0_8_ = uVar13;
  auVar287._10_2_ = uVar121;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = uVar121;
  auVar286._0_8_ = uVar13;
  uVar121 = (undefined2)(uVar13 >> 0x10);
  auVar55._4_8_ = auVar286._8_8_;
  auVar55._2_2_ = uVar121;
  auVar55._0_2_ = uVar121;
  uVar14 = *(ulong *)(prim + ((ulong)(byte)PVar15 * 0x20 - uVar60) + 6);
  uVar121 = (undefined2)(uVar14 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar14;
  auVar98._12_2_ = uVar121;
  auVar98._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar14 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar14;
  auVar97._10_2_ = uVar121;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar121;
  auVar96._0_8_ = uVar14;
  uVar121 = (undefined2)(uVar14 >> 0x10);
  auVar56._4_8_ = auVar96._8_8_;
  auVar56._2_2_ = uVar121;
  auVar56._0_2_ = uVar121;
  fVar184 = (float)(auVar56._0_4_ >> 0x10);
  fVar239 = (float)(auVar96._8_4_ >> 0x10);
  uVar60 = *(ulong *)(prim + uVar60 * 0x23 + 6);
  uVar121 = (undefined2)(uVar60 >> 0x30);
  auVar302._8_4_ = 0;
  auVar302._0_8_ = uVar60;
  auVar302._12_2_ = uVar121;
  auVar302._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar60 >> 0x20);
  auVar301._12_4_ = auVar302._12_4_;
  auVar301._8_2_ = 0;
  auVar301._0_8_ = uVar60;
  auVar301._10_2_ = uVar121;
  auVar300._10_6_ = auVar301._10_6_;
  auVar300._8_2_ = uVar121;
  auVar300._0_8_ = uVar60;
  uVar121 = (undefined2)(uVar60 >> 0x10);
  auVar57._4_8_ = auVar300._8_8_;
  auVar57._2_2_ = uVar121;
  auVar57._0_2_ = uVar121;
  auVar173._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar153) * fVar279 + fVar153) - fVar316) *
                fVar123,((((float)(int)(short)uVar68 - (float)(int)(short)uVar73) * fVar279 +
                         (float)(int)(short)uVar73) - fVar311) * fVar167);
  auVar173._8_4_ =
       ((((float)(auVar170._8_4_ >> 0x10) - fVar196) * fVar279 + fVar196) - fVar317) * fVar185;
  auVar173._12_4_ =
       ((((float)(auVar171._12_4_ >> 0x10) - (float)(auVar291._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar291._12_4_ >> 0x10)) - fVar318) * fVar240;
  auVar245._0_4_ =
       ((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar279 + (float)(int)(short)uVar7)
       - fVar311) * fVar167;
  auVar245._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar154) * fVar279 + fVar154) - fVar316) * fVar123;
  auVar245._8_4_ =
       ((((float)(auVar242._8_4_ >> 0x10) - fVar222) * fVar279 + fVar222) - fVar317) * fVar185;
  auVar245._12_4_ =
       ((((float)(auVar243._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar318) * fVar240;
  auVar264._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar166) * fVar279 + fVar166) - fVar272) *
                fVar124,((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar279 +
                         (float)(int)(short)uVar9) - fVar260) * fVar81);
  auVar264._8_4_ =
       ((((float)(auVar261._8_4_ >> 0x10) - fVar223) * fVar279 + fVar223) - fVar273) * fVar194;
  auVar264._12_4_ =
       ((((float)(auVar262._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar310) * fVar253;
  auVar278._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar70) * fVar279 +
        (float)(int)(short)uVar70) - fVar260) * fVar81;
  auVar278._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar168) * fVar279 + fVar168) - fVar272) * fVar124;
  auVar278._8_4_ =
       ((((float)(auVar275._8_4_ >> 0x10) - fVar224) * fVar279 + fVar224) - fVar273) * fVar194;
  auVar278._12_4_ =
       ((((float)(auVar276._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar310) * fVar253;
  auVar289._0_8_ =
       CONCAT44(((((float)(auVar55._0_4_ >> 0x10) - fVar183) * fVar279 + fVar183) - fVar258) *
                fVar152,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar279 +
                         (float)(int)(short)uVar12) - fVar255) * fVar122);
  auVar289._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - fVar238) * fVar279 + fVar238) - fVar259) * fVar195;
  auVar289._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar274) * fVar254;
  auVar303._0_4_ =
       ((((float)(int)(short)uVar60 - (float)(int)(short)uVar14) * fVar279 +
        (float)(int)(short)uVar14) - fVar255) * fVar122;
  auVar303._4_4_ =
       ((((float)(auVar57._0_4_ >> 0x10) - fVar184) * fVar279 + fVar184) - fVar258) * fVar152;
  auVar303._8_4_ =
       ((((float)(auVar300._8_4_ >> 0x10) - fVar239) * fVar279 + fVar239) - fVar259) * fVar195;
  auVar303._12_4_ =
       ((((float)(auVar301._12_4_ >> 0x10) - (float)(auVar97._12_4_ >> 0x10)) * fVar279 +
        (float)(auVar97._12_4_ >> 0x10)) - fVar274) * fVar254;
  auVar155._8_4_ = auVar173._8_4_;
  auVar155._0_8_ = auVar173._0_8_;
  auVar155._12_4_ = auVar173._12_4_;
  auVar156 = minps(auVar155,auVar245);
  auVar99._8_4_ = auVar264._8_4_;
  auVar99._0_8_ = auVar264._0_8_;
  auVar99._12_4_ = auVar264._12_4_;
  auVar82 = minps(auVar99,auVar278);
  auVar156 = maxps(auVar156,auVar82);
  auVar100._8_4_ = auVar289._8_4_;
  auVar100._0_8_ = auVar289._0_8_;
  auVar100._12_4_ = auVar289._12_4_;
  auVar82 = minps(auVar100,auVar303);
  uVar59 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar134._4_4_ = uVar59;
  auVar134._0_4_ = uVar59;
  auVar134._8_4_ = uVar59;
  auVar134._12_4_ = uVar59;
  auVar82 = maxps(auVar82,auVar134);
  auVar82 = maxps(auVar156,auVar82);
  auVar156 = maxps(auVar173,auVar245);
  auVar265 = maxps(auVar264,auVar278);
  auVar156 = minps(auVar156,auVar265);
  local_278 = auVar82._0_4_ * 0.99999964;
  fStack_274 = auVar82._4_4_ * 0.99999964;
  fStack_270 = auVar82._8_4_ * 0.99999964;
  fStack_26c = auVar82._12_4_ * 0.99999964;
  auVar82 = maxps(auVar289,auVar303);
  fVar167 = ray->tfar;
  auVar101._4_4_ = fVar167;
  auVar101._0_4_ = fVar167;
  auVar101._8_4_ = fVar167;
  auVar101._12_4_ = fVar167;
  auVar82 = minps(auVar82,auVar101);
  auVar82 = minps(auVar156,auVar82);
  uVar75 = (uint)(byte)PVar15;
  auVar135._0_4_ = -(uint)(uVar75 != 0 && local_278 <= auVar82._0_4_ * 1.0000004);
  auVar135._4_4_ = -(uint)(1 < uVar75 && fStack_274 <= auVar82._4_4_ * 1.0000004);
  auVar135._8_4_ = -(uint)(2 < uVar75 && fStack_270 <= auVar82._8_4_ * 1.0000004);
  auVar135._12_4_ = -(uint)(3 < uVar75 && fStack_26c <= auVar82._12_4_ * 1.0000004);
  uVar75 = movmskps(uVar75,auVar135);
  if (uVar75 == 0) {
    return false;
  }
  uVar75 = uVar75 & 0xff;
  local_1f8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1f8._12_4_ = 0;
  local_380 = context;
  local_2e8 = prim;
LAB_00b1ac0b:
  local_2e0 = (ulong)uVar75;
  lVar21 = 0;
  if (local_2e0 != 0) {
    for (; (uVar75 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
    }
  }
  uVar75 = *(uint *)(local_2e8 + 2);
  pRVar67 = (RTCIntersectArguments *)(ulong)uVar75;
  local_388 = (ulong)*(uint *)(local_2e8 + lVar21 * 4 + 6);
  pGVar16 = (context->scene->geometries).items[(long)pRVar67].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                           local_388 *
                           pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_4b8 = pGVar16->fnumTimeSegments;
  fVar167 = (pGVar16->time_range).lower;
  fVar81 = (((ray->dir).field_0.m128[3] - fVar167) / ((pGVar16->time_range).upper - fVar167)) *
           local_4b8;
  fVar167 = floorf(fVar81);
  if (local_4b8 + -1.0 <= fVar167) {
    fVar167 = local_4b8 + -1.0;
  }
  fVar122 = 0.0;
  if (0.0 <= fVar167) {
    fVar122 = fVar167;
  }
  fVar81 = fVar81 - fVar122;
  fVar154 = 1.0 - fVar81;
  _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar69 = (long)(int)fVar122 * 0x38;
  lVar62 = *(long *)(_Var17 + lVar69);
  lVar18 = *(long *)(_Var17 + 0x10 + lVar69);
  lVar21 = uVar73 + 1;
  p_Var63 = pGVar16[4].occlusionFilterN;
  pRVar66 = *(RTCIntersectArguments **)(p_Var63 + lVar69);
  lVar19 = *(long *)(_Var17 + 0x38 + lVar69);
  lVar20 = *(long *)(_Var17 + 0x48 + lVar69);
  pfVar1 = (float *)(lVar19 + lVar20 * uVar73);
  pfVar2 = (float *)(lVar62 + lVar18 * uVar73);
  local_578._0_4_ = *pfVar2 * fVar154 + *pfVar1 * fVar81;
  local_578._4_4_ = pfVar2[1] * fVar154 + pfVar1[1] * fVar81;
  fStack_570 = pfVar2[2] * fVar154 + pfVar1[2] * fVar81;
  fVar168 = pfVar2[3] * fVar154 + pfVar1[3] * fVar81;
  pfVar1 = (float *)(*(long *)(p_Var63 + lVar69 + 0x38) +
                    uVar73 * *(long *)(p_Var63 + lVar69 + 0x48));
  pRVar3 = (RTCRayQueryFlags *)((long)&pRVar66->flags + *(long *)(p_Var63 + lVar69 + 0x10) * uVar73)
  ;
  pfVar2 = (float *)(lVar19 + lVar20 * lVar21);
  pfVar4 = (float *)(lVar62 + lVar18 * lVar21);
  fVar183 = *pfVar4 * fVar154 + *pfVar2 * fVar81;
  fVar184 = pfVar4[1] * fVar154 + pfVar2[1] * fVar81;
  fVar185 = pfVar4[2] * fVar154 + pfVar2[2] * fVar81;
  fVar194 = pfVar4[3] * fVar154 + pfVar2[3] * fVar81;
  pfVar2 = (float *)(*(long *)(p_Var63 + lVar69 + 0x38) +
                    *(long *)(p_Var63 + lVar69 + 0x48) * lVar21);
  pRVar5 = (RTCRayQueryFlags *)((long)&pRVar66->flags + *(long *)(p_Var63 + lVar69 + 0x10) * lVar21)
  ;
  fVar153 = ((float)*pRVar3 * fVar154 + *pfVar1 * fVar81) * 0.33333334 + (float)local_578._0_4_;
  fStack_4b4 = ((float)pRVar3[1] * fVar154 + pfVar1[1] * fVar81) * 0.33333334 +
               (float)local_578._4_4_;
  fStack_4b0 = ((float)pRVar3[2] * fVar154 + pfVar1[2] * fVar81) * 0.33333334 + fStack_570;
  fVar195 = fVar183 - (fVar154 * (float)*pRVar5 + fVar81 * *pfVar2) * 0.33333334;
  local_178 = fVar184 - (fVar154 * (float)pRVar5[1] + fVar81 * pfVar2[1]) * 0.33333334;
  local_188 = fVar185 - (fVar154 * (float)pRVar5[2] + fVar81 * pfVar2[2]) * 0.33333334;
  fVar167 = (ray->org).field_0.m128[0];
  fVar122 = (ray->org).field_0.m128[1];
  fVar123 = (ray->org).field_0.m128[2];
  local_318 = (ray->dir).field_0.m128[0];
  local_468 = (ray->dir).field_0.m128[1];
  fVar124 = (ray->dir).field_0.m128[2];
  fVar152 = (ray->dir).field_0.m128[3];
  fStack_13c = local_318 * local_318;
  fVar196 = local_468 * local_468;
  fVar222 = fVar124 * fVar124;
  fVar152 = fVar152 * fVar152;
  fVar166 = fStack_13c + fVar196 + fVar222;
  auVar186._0_8_ = CONCAT44(fVar196 + fVar196 + fVar152,fVar166);
  auVar186._8_4_ = fVar222 + fVar196 + fVar222;
  auVar186._12_4_ = fVar152 + fVar196 + fVar152;
  auVar174._8_4_ = auVar186._8_4_;
  auVar174._0_8_ = auVar186._0_8_;
  auVar174._12_4_ = auVar186._12_4_;
  auVar82 = rcpss(auVar174,auVar186);
  local_4e8 = (2.0 - fVar166 * auVar82._0_4_) * auVar82._0_4_ *
              (((fStack_570 + fStack_4b0 + local_188 + fVar185) * 0.25 - fVar123) * fVar124 +
              (((float)local_578._4_4_ + fStack_4b4 + local_178 + fVar184) * 0.25 - fVar122) *
              local_468 +
              (((float)local_578._0_4_ + fVar153 + fVar195 + fVar183) * 0.25 - fVar167) * local_318)
  ;
  local_308 = ZEXT416((uint)local_4e8);
  fVar167 = local_318 * local_4e8 + fVar167;
  fVar122 = local_468 * local_4e8 + fVar122;
  fVar123 = fVar124 * local_4e8 + fVar123;
  local_578._0_4_ = (float)local_578._0_4_ - fVar167;
  local_578._4_4_ = (float)local_578._4_4_ - fVar122;
  fStack_570 = fStack_570 - fVar123;
  fStack_56c = fVar168 - 0.0;
  fVar195 = fVar195 - fVar167;
  local_178 = local_178 - fVar122;
  local_188 = local_188 - fVar123;
  fStack_34c = (fVar194 - (fVar154 * (float)pRVar5[3] + fVar81 * pfVar2[3]) * 0.33333334) - 0.0;
  fVar153 = fVar153 - fVar167;
  fStack_4b4 = fStack_4b4 - fVar122;
  fStack_4b0 = fStack_4b0 - fVar123;
  fVar81 = (((float)pRVar3[3] * fVar154 + pfVar1[3] * fVar81) * 0.33333334 + fVar168) - 0.0;
  fVar183 = fVar183 - fVar167;
  fVar184 = fVar184 - fVar122;
  fVar185 = fVar185 - fVar123;
  fVar194 = fVar194 - 0.0;
  local_158 = fStack_56c;
  fStack_154 = fStack_56c;
  fStack_150 = fStack_56c;
  fStack_14c = fStack_56c;
  local_168 = fStack_4b4;
  fStack_164 = fStack_4b4;
  fStack_160 = fStack_4b4;
  fStack_15c = fStack_4b4;
  local_148 = fStack_13c + fVar222 + fVar196;
  fStack_144 = fStack_13c + fVar222 + fVar196;
  fStack_140 = fStack_13c + fVar222 + fVar196;
  fStack_13c = fStack_13c + fVar222 + fVar196;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  local_358 = fVar195;
  fStack_354 = local_178;
  fStack_350 = local_188;
  local_2a8 = fStack_34c;
  fStack_2a4 = fStack_34c;
  fStack_2a0 = fStack_34c;
  fStack_29c = fStack_34c;
  local_198 = fVar183;
  fStack_194 = fVar183;
  fStack_190 = fVar183;
  fStack_18c = fVar183;
  local_1a8 = fVar184;
  fStack_1a4 = fVar184;
  fStack_1a0 = fVar184;
  fStack_19c = fVar184;
  local_1b8 = fVar185;
  fStack_1b4 = fVar185;
  fStack_1b0 = fVar185;
  fStack_1ac = fVar185;
  local_1c8 = fVar194;
  fStack_1c4 = fVar194;
  fStack_1c0 = fVar194;
  fStack_1bc = fVar194;
  fStack_314 = local_318;
  fStack_310 = local_318;
  fStack_30c = local_318;
  fStack_464 = local_468;
  fStack_460 = local_468;
  fStack_45c = local_468;
  local_2b8 = ABS(local_148);
  fStack_2b4 = ABS(fStack_144);
  fStack_2b0 = ABS(fStack_140);
  fStack_2ac = ABS(fStack_13c);
  fVar167 = 1.4013e-45;
  uVar73 = 0;
  bVar71 = false;
  local_1e8 = 0.0;
  fStack_1e4 = 1.0;
  local_218 = (float)local_578._0_4_;
  fStack_214 = (float)local_578._0_4_;
  fStack_210 = (float)local_578._0_4_;
  fStack_20c = (float)local_578._0_4_;
  local_228 = (float)local_578._4_4_;
  fStack_224 = (float)local_578._4_4_;
  fStack_220 = (float)local_578._4_4_;
  fStack_21c = (float)local_578._4_4_;
  local_238 = fStack_570;
  fStack_234 = fStack_570;
  fStack_230 = fStack_570;
  fStack_22c = fStack_570;
  local_368 = fVar153;
  fStack_364 = fVar153;
  fStack_360 = fVar153;
  fStack_35c = fVar153;
  local_248 = fStack_4b0;
  fStack_244 = fStack_4b0;
  fStack_240 = fStack_4b0;
  fStack_23c = fStack_4b0;
  local_378 = fVar81;
  fStack_374 = fVar81;
  fStack_370 = fVar81;
  fStack_36c = fVar81;
  fVar154 = fVar153;
  fVar166 = fVar153;
  fVar168 = fVar153;
  fVar122 = fVar81;
  fVar123 = fVar81;
  fVar152 = fVar81;
  fStack_4e4 = local_4e8;
  fStack_4e0 = local_4e8;
  fStack_4dc = local_4e8;
  local_4b8 = fVar153;
  fStack_4ac = fVar81;
  do {
    context = local_380;
    uVar59 = SUB84(pRVar66,0);
    iVar72 = (int)uVar73;
    local_448 = fStack_1e4 - local_1e8;
    uStack_1e0 = 0;
    uStack_1dc = 0;
    fStack_444 = local_448;
    fStack_440 = local_448;
    fStack_43c = local_448;
    local_458 = local_1e8;
    fStack_454 = local_1e8;
    fStack_450 = local_1e8;
    fStack_44c = local_1e8;
    fVar196 = local_448 * 0.0 + local_1e8;
    fVar222 = local_448 * 0.33333334 + local_1e8;
    fVar223 = local_448 * 0.6666667 + local_1e8;
    fVar224 = local_448 * 1.0 + local_1e8;
    fVar284 = 1.0 - fVar196;
    fVar293 = 1.0 - fVar222;
    fVar295 = 1.0 - fVar223;
    fVar297 = 1.0 - fVar224;
    fVar306 = fVar153 * fVar284 + fVar195 * fVar196;
    fVar308 = fVar154 * fVar293 + fVar195 * fVar222;
    fVar311 = fVar166 * fVar295 + fVar195 * fVar223;
    fVar316 = fVar168 * fVar297 + fVar195 * fVar224;
    fVar238 = local_168 * fVar284 + local_178 * fVar196;
    fVar239 = fStack_164 * fVar293 + fStack_174 * fVar222;
    fVar240 = fStack_160 * fVar295 + fStack_170 * fVar223;
    fVar253 = fStack_15c * fVar297 + fStack_16c * fVar224;
    fVar317 = local_248 * fVar284 + local_188 * fVar196;
    fVar318 = fStack_244 * fVar293 + fStack_184 * fVar222;
    fVar281 = fStack_240 * fVar295 + fStack_180 * fVar223;
    fVar282 = fStack_23c * fVar297 + fStack_17c * fVar224;
    fVar294 = fVar81 * fVar284 + local_2a8 * fVar196;
    fVar296 = fVar122 * fVar293 + fStack_2a4 * fVar222;
    fVar298 = fVar123 * fVar295 + fStack_2a0 * fVar223;
    fVar305 = fVar152 * fVar297 + fStack_29c * fVar224;
    fVar254 = (local_218 * fVar284 + fVar153 * fVar196) * fVar284 + fVar196 * fVar306;
    fVar154 = (fStack_214 * fVar293 + fVar154 * fVar222) * fVar293 + fVar222 * fVar308;
    fVar166 = (fStack_210 * fVar295 + fVar166 * fVar223) * fVar295 + fVar223 * fVar311;
    fVar168 = (fStack_20c * fVar297 + fVar168 * fVar224) * fVar297 + fVar224 * fVar316;
    fVar260 = (local_228 * fVar284 + local_168 * fVar196) * fVar284 + fVar196 * fVar238;
    fVar272 = (fStack_224 * fVar293 + fStack_164 * fVar222) * fVar293 + fVar222 * fVar239;
    fVar273 = (fStack_220 * fVar295 + fStack_160 * fVar223) * fVar295 + fVar223 * fVar240;
    fVar310 = (fStack_21c * fVar297 + fStack_15c * fVar224) * fVar297 + fVar224 * fVar253;
    fVar255 = (local_238 * fVar284 + local_248 * fVar196) * fVar284 + fVar196 * fVar317;
    fVar258 = (fStack_234 * fVar293 + fStack_244 * fVar222) * fVar293 + fVar222 * fVar318;
    fVar259 = (fStack_230 * fVar295 + fStack_240 * fVar223) * fVar295 + fVar223 * fVar281;
    fVar274 = (fStack_22c * fVar297 + fStack_23c * fVar224) * fVar297 + fVar224 * fVar282;
    fVar279 = (local_158 * fVar284 + fVar81 * fVar196) * fVar284 + fVar196 * fVar294;
    fVar280 = (fStack_154 * fVar293 + fVar122 * fVar222) * fVar293 + fVar222 * fVar296;
    fVar283 = (fStack_150 * fVar295 + fVar123 * fVar223) * fVar295 + fVar223 * fVar298;
    fVar292 = (fStack_14c * fVar297 + fVar152 * fVar224) * fVar297 + fVar224 * fVar305;
    fVar306 = fVar306 * fVar284 + (fVar195 * fVar284 + local_198 * fVar196) * fVar196;
    fVar308 = fVar308 * fVar293 + (fVar195 * fVar293 + fStack_194 * fVar222) * fVar222;
    fVar311 = fVar311 * fVar295 + (fVar195 * fVar295 + fStack_190 * fVar223) * fVar223;
    fVar316 = fVar316 * fVar297 + (fVar195 * fVar297 + fStack_18c * fVar224) * fVar224;
    fVar122 = fVar238 * fVar284 + (local_178 * fVar284 + local_1a8 * fVar196) * fVar196;
    fVar123 = fVar239 * fVar293 + (fStack_174 * fVar293 + fStack_1a4 * fVar222) * fVar222;
    fVar152 = fVar240 * fVar295 + (fStack_170 * fVar295 + fStack_1a0 * fVar223) * fVar223;
    fVar153 = fVar253 * fVar297 + (fStack_16c * fVar297 + fStack_19c * fVar224) * fVar224;
    fVar253 = fVar317 * fVar284 + (local_188 * fVar284 + local_1b8 * fVar196) * fVar196;
    fVar317 = fVar318 * fVar293 + (fStack_184 * fVar293 + fStack_1b4 * fVar222) * fVar222;
    fVar318 = fVar281 * fVar295 + (fStack_180 * fVar295 + fStack_1b0 * fVar223) * fVar223;
    fVar281 = fVar282 * fVar297 + (fStack_17c * fVar297 + fStack_1ac * fVar224) * fVar224;
    fVar294 = fVar294 * fVar284 + (local_2a8 * fVar284 + local_1c8 * fVar196) * fVar196;
    fVar238 = fVar296 * fVar293 + (fStack_2a4 * fVar293 + fStack_1c4 * fVar222) * fVar222;
    fVar239 = fVar298 * fVar295 + (fStack_2a0 * fVar295 + fStack_1c0 * fVar223) * fVar223;
    fVar240 = fVar305 * fVar297 + (fStack_29c * fVar297 + fStack_1bc * fVar224) * fVar224;
    local_4c8 = fVar284 * fVar254 + fVar196 * fVar306;
    fStack_4c4 = fVar293 * fVar154 + fVar222 * fVar308;
    fStack_4c0 = fVar295 * fVar166 + fVar223 * fVar311;
    fStack_4bc = fVar297 * fVar168 + fVar224 * fVar316;
    fVar319 = fVar284 * fVar260 + fVar196 * fVar122;
    fVar320 = fVar293 * fVar272 + fVar222 * fVar123;
    fVar321 = fVar295 * fVar273 + fVar223 * fVar152;
    fVar322 = fVar297 * fVar310 + fVar224 * fVar153;
    fVar305 = fVar284 * fVar255 + fVar196 * fVar253;
    fVar282 = fVar293 * fVar258 + fVar222 * fVar317;
    fVar307 = fVar295 * fVar259 + fVar223 * fVar318;
    fVar309 = fVar297 * fVar274 + fVar224 * fVar281;
    fVar81 = local_448 * 0.11111111;
    fVar296 = fVar284 * fVar279 + fVar196 * fVar294;
    fVar298 = fVar293 * fVar280 + fVar222 * fVar238;
    auVar290._0_8_ = CONCAT44(fVar298,fVar296);
    auVar290._8_4_ = fVar295 * fVar283 + fVar223 * fVar239;
    auVar290._12_4_ = fVar297 * fVar292 + fVar224 * fVar240;
    local_3a8 = (fVar306 - fVar254) * 3.0 * fVar81;
    fStack_3a4 = (fVar308 - fVar154) * 3.0 * fVar81;
    fStack_3a0 = (fVar311 - fVar166) * 3.0 * fVar81;
    fStack_39c = (fVar316 - fVar168) * 3.0 * fVar81;
    local_3b8 = (fVar122 - fVar260) * 3.0 * fVar81;
    fStack_3b4 = (fVar123 - fVar272) * 3.0 * fVar81;
    fStack_3b0 = (fVar152 - fVar273) * 3.0 * fVar81;
    fStack_3ac = (fVar153 - fVar310) * 3.0 * fVar81;
    local_3c8 = (fVar253 - fVar255) * 3.0 * fVar81;
    fStack_3c4 = (fVar317 - fVar258) * 3.0 * fVar81;
    fStack_3c0 = (fVar318 - fVar259) * 3.0 * fVar81;
    fStack_3bc = (fVar281 - fVar274) * 3.0 * fVar81;
    fVar123 = fVar81 * (fVar238 - fVar280) * 3.0;
    fVar153 = fVar81 * (fVar239 - fVar283) * 3.0;
    fVar166 = fVar81 * (fVar240 - fVar292) * 3.0;
    local_3d8._4_4_ = fStack_4c0;
    local_3d8._0_4_ = fStack_4c4;
    fStack_3d0 = fStack_4bc;
    fStack_3cc = 0.0;
    local_3e8._4_4_ = fVar321;
    local_3e8._0_4_ = fVar320;
    fStack_3e0 = fVar322;
    fStack_3dc = 0.0;
    auVar175._4_4_ = auVar290._8_4_;
    auVar175._0_4_ = fVar298;
    auVar175._8_4_ = auVar290._12_4_;
    auVar175._12_4_ = 0;
    auVar136._0_8_ = CONCAT44(auVar290._8_4_ - fVar153,fVar298 - fVar123);
    auVar136._8_4_ = auVar290._12_4_ - fVar166;
    auVar136._12_4_ = 0;
    local_328._0_4_ = fVar320 - fVar319;
    local_328._4_4_ = fVar321 - fVar320;
    fStack_320 = fVar322 - fVar321;
    fStack_31c = 0.0 - fVar322;
    local_3f8._4_4_ = fVar307;
    local_3f8._0_4_ = fVar282;
    fStack_3f0 = fVar309;
    fStack_3ec = 0.0;
    local_338._0_4_ = fVar282 - fVar305;
    local_338._4_4_ = fVar307 - fVar282;
    fStack_330 = fVar309 - fVar307;
    fStack_32c = 0.0 - fVar309;
    fVar196 = local_3b8 * (float)local_338._0_4_ - local_3c8 * (float)local_328._0_4_;
    fVar222 = fStack_3b4 * (float)local_338._4_4_ - fStack_3c4 * (float)local_328._4_4_;
    fVar223 = fStack_3b0 * fStack_330 - fStack_3c0 * fStack_320;
    fVar224 = fStack_3ac * fStack_32c - fStack_3bc * fStack_31c;
    local_348 = fStack_4c4 - local_4c8;
    fStack_344 = fStack_4c0 - fStack_4c4;
    fStack_340 = fStack_4bc - fStack_4c0;
    fStack_33c = 0.0 - fStack_4bc;
    fVar238 = local_3c8 * local_348 - local_3a8 * (float)local_338._0_4_;
    fVar239 = fStack_3c4 * fStack_344 - fStack_3a4 * (float)local_338._4_4_;
    fVar240 = fStack_3c0 * fStack_340 - fStack_3a0 * fStack_330;
    fVar253 = fStack_3bc * fStack_33c - fStack_39c * fStack_32c;
    fVar254 = local_3a8 * (float)local_328._0_4_ - local_3b8 * local_348;
    fVar260 = fStack_3a4 * (float)local_328._4_4_ - fStack_3b4 * fStack_344;
    fVar272 = fStack_3a0 * fStack_320 - fStack_3b0 * fStack_340;
    fVar273 = fStack_39c * fStack_31c - fStack_3ac * fStack_33c;
    auVar246._0_4_ =
         (float)local_328._0_4_ * (float)local_328._0_4_ +
         (float)local_338._0_4_ * (float)local_338._0_4_;
    auVar246._4_4_ =
         (float)local_328._4_4_ * (float)local_328._4_4_ +
         (float)local_338._4_4_ * (float)local_338._4_4_;
    auVar246._8_4_ = fStack_320 * fStack_320 + fStack_330 * fStack_330;
    auVar246._12_4_ = fStack_31c * fStack_31c + fStack_32c * fStack_32c;
    auVar227._0_4_ = local_348 * local_348 + auVar246._0_4_;
    auVar227._4_4_ = fStack_344 * fStack_344 + auVar246._4_4_;
    auVar227._8_4_ = fStack_340 * fStack_340 + auVar246._8_4_;
    auVar227._12_4_ = fStack_33c * fStack_33c + auVar246._12_4_;
    auVar82 = rcpps(auVar246,auVar227);
    fVar122 = auVar82._0_4_;
    fVar152 = auVar82._4_4_;
    fVar154 = auVar82._8_4_;
    fVar168 = auVar82._12_4_;
    fVar122 = (1.0 - fVar122 * auVar227._0_4_) * fVar122 + fVar122;
    fVar152 = (1.0 - fVar152 * auVar227._4_4_) * fVar152 + fVar152;
    fVar154 = (1.0 - fVar154 * auVar227._8_4_) * fVar154 + fVar154;
    fVar168 = (1.0 - fVar168 * auVar227._12_4_) * fVar168 + fVar168;
    fVar310 = (float)local_338._0_4_ * fStack_3b4 - (float)local_328._0_4_ * fStack_3c4;
    fVar255 = (float)local_338._4_4_ * fStack_3b0 - (float)local_328._4_4_ * fStack_3c0;
    fVar258 = fStack_330 * fStack_3ac - fStack_320 * fStack_3bc;
    fVar259 = fStack_32c * 0.0 - fStack_31c * 0.0;
    local_428 = fStack_3c4;
    fStack_424 = fStack_3c0;
    fStack_420 = fStack_3bc;
    fStack_41c = 0.0;
    fVar274 = local_348 * fStack_3c4 - (float)local_338._0_4_ * fStack_3a4;
    fVar280 = fStack_344 * fStack_3c0 - (float)local_338._4_4_ * fStack_3a0;
    fVar283 = fStack_340 * fStack_3bc - fStack_330 * fStack_39c;
    fVar292 = fStack_33c * 0.0 - fStack_32c * 0.0;
    local_418._4_4_ = fStack_3b0;
    local_418._0_4_ = fStack_3b4;
    fStack_410 = fStack_3ac;
    fStack_40c = 0.0;
    local_408 = fStack_3a4;
    fStack_404 = fStack_3a0;
    fStack_400 = fStack_39c;
    fStack_3fc = 0.0;
    fVar306 = (float)local_328._0_4_ * fStack_3a4 - local_348 * fStack_3b4;
    fVar308 = (float)local_328._4_4_ * fStack_3a0 - fStack_344 * fStack_3b0;
    fVar311 = fStack_320 * fStack_39c - fStack_340 * fStack_3ac;
    fVar316 = fStack_31c * 0.0 - fStack_33c * 0.0;
    auVar213._0_4_ = (fVar196 * fVar196 + fVar238 * fVar238 + fVar254 * fVar254) * fVar122;
    auVar213._4_4_ = (fVar222 * fVar222 + fVar239 * fVar239 + fVar260 * fVar260) * fVar152;
    auVar213._8_4_ = (fVar223 * fVar223 + fVar240 * fVar240 + fVar272 * fVar272) * fVar154;
    auVar213._12_4_ = (fVar224 * fVar224 + fVar253 * fVar253 + fVar273 * fVar273) * fVar168;
    auVar256._0_4_ = (fVar310 * fVar310 + fVar274 * fVar274 + fVar306 * fVar306) * fVar122;
    auVar256._4_4_ = (fVar255 * fVar255 + fVar280 * fVar280 + fVar308 * fVar308) * fVar152;
    auVar256._8_4_ = (fVar258 * fVar258 + fVar283 * fVar283 + fVar311 * fVar311) * fVar154;
    auVar256._12_4_ = (fVar259 * fVar259 + fVar292 * fVar292 + fVar316 * fVar316) * fVar168;
    auVar265 = maxps(auVar213,auVar256);
    auVar102._8_4_ = auVar290._8_4_;
    auVar102._0_8_ = auVar290._0_8_;
    auVar102._12_4_ = auVar290._12_4_;
    auVar25._4_4_ = fVar298 + fVar123;
    auVar25._0_4_ = fVar296 + fVar81 * (fVar294 - fVar279) * 3.0;
    auVar25._8_4_ = auVar290._8_4_ + fVar153;
    auVar25._12_4_ = auVar290._12_4_ + fVar166;
    auVar82 = maxps(auVar102,auVar25);
    auVar247._8_4_ = auVar136._8_4_;
    auVar247._0_8_ = auVar136._0_8_;
    auVar247._12_4_ = 0;
    auVar156 = maxps(auVar247,auVar175);
    auVar82 = maxps(auVar82,auVar156);
    auVar291 = minps(auVar290,auVar25);
    auVar156 = minps(auVar136,auVar175);
    auVar291 = minps(auVar291,auVar156);
    auVar156 = sqrtps(auVar156,auVar265);
    auVar265 = rsqrtps(auVar175,auVar227);
    fVar81 = auVar265._0_4_;
    fVar122 = auVar265._4_4_;
    fVar123 = auVar265._8_4_;
    fVar152 = auVar265._12_4_;
    fVar153 = fVar81 * fVar81 * auVar227._0_4_ * -0.5 * fVar81 + fVar81 * 1.5;
    fVar154 = fVar122 * fVar122 * auVar227._4_4_ * -0.5 * fVar122 + fVar122 * 1.5;
    fVar166 = fVar123 * fVar123 * auVar227._8_4_ * -0.5 * fVar123 + fVar123 * 1.5;
    fVar168 = fVar152 * fVar152 * auVar227._12_4_ * -0.5 * fVar152 + fVar152 * 1.5;
    fVar238 = 0.0 - fVar319;
    fVar240 = 0.0 - fVar320;
    fVar254 = 0.0 - fVar321;
    fVar272 = 0.0 - fVar322;
    local_438._0_4_ = 0.0 - fVar305;
    local_438._4_4_ = 0.0 - fVar282;
    fStack_430 = 0.0 - fVar307;
    fStack_42c = 0.0 - fVar309;
    auVar29._4_4_ = fStack_464;
    auVar29._0_4_ = local_468;
    auVar29._8_4_ = fStack_460;
    auVar29._12_4_ = fStack_45c;
    fVar310 = 0.0 - local_4c8;
    fVar255 = 0.0 - fStack_4c4;
    fVar258 = 0.0 - fStack_4c0;
    fVar259 = 0.0 - fStack_4bc;
    auVar228._0_4_ = fVar124 * (float)local_338._0_4_ * fVar153;
    auVar228._4_4_ = fVar124 * (float)local_338._4_4_ * fVar154;
    auVar228._8_4_ = fVar124 * fStack_330 * fVar166;
    auVar228._12_4_ = fVar124 * fStack_32c * fVar168;
    fVar196 = local_318 * local_348 * fVar153 +
              local_468 * (float)local_328._0_4_ * fVar153 + auVar228._0_4_;
    fVar222 = fStack_314 * fStack_344 * fVar154 +
              fStack_464 * (float)local_328._4_4_ * fVar154 + auVar228._4_4_;
    fVar223 = fStack_310 * fStack_340 * fVar166 + fStack_460 * fStack_320 * fVar166 + auVar228._8_4_
    ;
    fVar224 = fStack_30c * fStack_33c * fVar168 +
              fStack_45c * fStack_31c * fVar168 + auVar228._12_4_;
    local_4d8._0_4_ =
         local_348 * fVar153 * fVar310 +
         (float)local_328._0_4_ * fVar153 * fVar238 +
         (float)local_338._0_4_ * fVar153 * (float)local_438._0_4_;
    local_4d8._4_4_ =
         fStack_344 * fVar154 * fVar255 +
         (float)local_328._4_4_ * fVar154 * fVar240 +
         (float)local_338._4_4_ * fVar154 * (float)local_438._4_4_;
    fStack_4d0 = fStack_340 * fVar166 * fVar258 +
                 fStack_320 * fVar166 * fVar254 + fStack_330 * fVar166 * fStack_430;
    fStack_4cc = fStack_33c * fVar168 * fVar259 +
                 fStack_31c * fVar168 * fVar272 + fStack_32c * fVar168 * fStack_42c;
    local_1d8 = (local_318 * fVar310 + local_468 * fVar238 + fVar124 * (float)local_438._0_4_) -
                fVar196 * (float)local_4d8._0_4_;
    fStack_1d4 = (fStack_314 * fVar255 + fStack_464 * fVar240 + fVar124 * (float)local_438._4_4_) -
                 fVar222 * (float)local_4d8._4_4_;
    fStack_1d0 = (fStack_310 * fVar258 + fStack_460 * fVar254 + fVar124 * fStack_430) -
                 fVar223 * fStack_4d0;
    fStack_1cc = (fStack_30c * fVar259 + fStack_45c * fVar272 + fVar124 * fStack_42c) -
                 fVar224 * fStack_4cc;
    fVar292 = (fVar310 * fVar310 +
              fVar238 * fVar238 + (float)local_438._0_4_ * (float)local_438._0_4_) -
              (float)local_4d8._0_4_ * (float)local_4d8._0_4_;
    fVar294 = (fVar255 * fVar255 +
              fVar240 * fVar240 + (float)local_438._4_4_ * (float)local_438._4_4_) -
              (float)local_4d8._4_4_ * (float)local_4d8._4_4_;
    fVar296 = (fVar258 * fVar258 + fVar254 * fVar254 + fStack_430 * fStack_430) -
              fStack_4d0 * fStack_4d0;
    fVar298 = (fVar259 * fVar259 + fVar272 * fVar272 + fStack_42c * fStack_42c) -
              fStack_4cc * fStack_4cc;
    fVar81 = (auVar82._0_4_ + auVar156._0_4_) * 1.0000002;
    fVar122 = (auVar82._4_4_ + auVar156._4_4_) * 1.0000002;
    fVar123 = (auVar82._8_4_ + auVar156._8_4_) * 1.0000002;
    fVar152 = (auVar82._12_4_ + auVar156._12_4_) * 1.0000002;
    fVar274 = fVar292 - fVar81 * fVar81;
    fVar279 = fVar294 - fVar122 * fVar122;
    fVar280 = fVar296 - fVar123 * fVar123;
    fVar283 = fVar298 - fVar152 * fVar152;
    fVar81 = fVar196 * fVar196;
    fVar122 = fVar222 * fVar222;
    fVar123 = fVar223 * fVar223;
    fVar152 = fVar224 * fVar224;
    fVar239 = local_148 - fVar81;
    fVar253 = fStack_144 - fVar122;
    fVar260 = fStack_140 - fVar123;
    fVar273 = fStack_13c - fVar152;
    local_1d8 = local_1d8 + local_1d8;
    fStack_1d4 = fStack_1d4 + fStack_1d4;
    fStack_1d0 = fStack_1d0 + fStack_1d0;
    fStack_1cc = fStack_1cc + fStack_1cc;
    local_508._0_4_ = fVar239 * 4.0;
    local_508._4_4_ = fVar253 * 4.0;
    fStack_500 = fVar260 * 4.0;
    fStack_4fc = fVar273 * 4.0;
    auVar103._0_4_ = local_1d8 * local_1d8 - (float)local_508._0_4_ * fVar274;
    auVar103._4_4_ = fStack_1d4 * fStack_1d4 - (float)local_508._4_4_ * fVar279;
    auVar103._8_4_ = fStack_1d0 * fStack_1d0 - fStack_500 * fVar280;
    auVar103._12_4_ = fStack_1cc * fStack_1cc - fStack_4fc * fVar283;
    local_4f8._4_4_ = (auVar291._4_4_ - auVar156._4_4_) * 0.99999976;
    local_4f8._0_4_ = (auVar291._0_4_ - auVar156._0_4_) * 0.99999976;
    fStack_4f0 = (auVar291._8_4_ - auVar156._8_4_) * 0.99999976;
    fStack_4ec = (auVar291._12_4_ - auVar156._12_4_) * 0.99999976;
    auVar214._4_4_ = -(uint)(0.0 <= auVar103._4_4_);
    auVar214._0_4_ = -(uint)(0.0 <= auVar103._0_4_);
    auVar214._8_4_ = -(uint)(0.0 <= auVar103._8_4_);
    auVar214._12_4_ = -(uint)(0.0 <= auVar103._12_4_);
    uVar65 = (undefined4)((ulong)lVar62 >> 0x20);
    iVar58 = movmskps((int)lVar62,auVar214);
    if (iVar58 == 0) {
      iVar58 = 0;
      auVar257 = _DAT_01f7aa00;
      auVar324 = _DAT_01f7a9f0;
    }
    else {
      auVar156 = sqrtps(auVar29,auVar103);
      bVar74 = 0.0 <= auVar103._0_4_;
      uVar76 = -(uint)bVar74;
      bVar22 = 0.0 <= auVar103._4_4_;
      uVar77 = -(uint)bVar22;
      bVar23 = 0.0 <= auVar103._8_4_;
      uVar78 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar103._12_4_;
      uVar79 = -(uint)bVar24;
      auVar137._0_4_ = fVar239 + fVar239;
      auVar137._4_4_ = fVar253 + fVar253;
      auVar137._8_4_ = fVar260 + fVar260;
      auVar137._12_4_ = fVar273 + fVar273;
      auVar82 = rcpps(auVar228,auVar137);
      fVar317 = auVar82._0_4_;
      fVar318 = auVar82._4_4_;
      fVar281 = auVar82._8_4_;
      fVar284 = auVar82._12_4_;
      fVar317 = (1.0 - auVar137._0_4_ * fVar317) * fVar317 + fVar317;
      fVar318 = (1.0 - auVar137._4_4_ * fVar318) * fVar318 + fVar318;
      fVar281 = (1.0 - auVar137._8_4_ * fVar281) * fVar281 + fVar281;
      fVar284 = (1.0 - auVar137._12_4_ * fVar284) * fVar284 + fVar284;
      fVar306 = (-local_1d8 - auVar156._0_4_) * fVar317;
      fVar308 = (-fStack_1d4 - auVar156._4_4_) * fVar318;
      fVar311 = (-fStack_1d0 - auVar156._8_4_) * fVar281;
      fVar316 = (-fStack_1cc - auVar156._12_4_) * fVar284;
      fVar317 = (auVar156._0_4_ - local_1d8) * fVar317;
      fVar318 = (auVar156._4_4_ - fStack_1d4) * fVar318;
      fVar281 = (auVar156._8_4_ - fStack_1d0) * fVar281;
      fVar284 = (auVar156._12_4_ - fStack_1cc) * fVar284;
      local_208 = (fVar196 * fVar306 + (float)local_4d8._0_4_) * fVar153;
      fStack_204 = (fVar222 * fVar308 + (float)local_4d8._4_4_) * fVar154;
      fStack_200 = (fVar223 * fVar311 + fStack_4d0) * fVar166;
      fStack_1fc = (fVar224 * fVar316 + fStack_4cc) * fVar168;
      local_478._4_4_ = (fVar222 * fVar318 + (float)local_4d8._4_4_) * fVar154;
      local_478._0_4_ = (fVar196 * fVar317 + (float)local_4d8._0_4_) * fVar153;
      fStack_470 = (fVar223 * fVar281 + fStack_4d0) * fVar166;
      fStack_46c = (fVar224 * fVar284 + fStack_4cc) * fVar168;
      auVar138._0_4_ = (uint)fVar306 & uVar76;
      auVar138._4_4_ = (uint)fVar308 & uVar77;
      auVar138._8_4_ = (uint)fVar311 & uVar78;
      auVar138._12_4_ = (uint)fVar316 & uVar79;
      auVar324._0_8_ = CONCAT44(~uVar77,~uVar76) & 0x7f8000007f800000;
      auVar324._8_4_ = ~uVar78 & 0x7f800000;
      auVar324._12_4_ = ~uVar79 & 0x7f800000;
      auVar324 = auVar324 | auVar138;
      auVar312._0_4_ = (uint)fVar317 & uVar76;
      auVar312._4_4_ = (uint)fVar318 & uVar77;
      auVar312._8_4_ = (uint)fVar281 & uVar78;
      auVar312._12_4_ = (uint)fVar284 & uVar79;
      auVar257._0_8_ = CONCAT44(~uVar77,~uVar76) & 0xff800000ff800000;
      auVar257._8_4_ = ~uVar78 & 0xff800000;
      auVar257._12_4_ = ~uVar79 & 0xff800000;
      auVar257 = auVar257 | auVar312;
      auVar229._0_8_ = CONCAT44(fVar122,fVar81) & 0x7fffffff7fffffff;
      auVar229._8_4_ = ABS(fVar123);
      auVar229._12_4_ = ABS(fVar152);
      auVar33._4_4_ = fStack_2b4;
      auVar33._0_4_ = local_2b8;
      auVar33._8_4_ = fStack_2b0;
      auVar33._12_4_ = fStack_2ac;
      auVar82 = maxps(auVar33,auVar229);
      fVar306 = auVar82._0_4_ * 1.9073486e-06;
      fVar308 = auVar82._4_4_ * 1.9073486e-06;
      fVar311 = auVar82._8_4_ * 1.9073486e-06;
      fVar316 = auVar82._12_4_ * 1.9073486e-06;
      auVar313._0_4_ = -(uint)(ABS(fVar239) < fVar306 && bVar74);
      auVar313._4_4_ = -(uint)(ABS(fVar253) < fVar308 && bVar22);
      auVar313._8_4_ = -(uint)(ABS(fVar260) < fVar311 && bVar23);
      auVar313._12_4_ = -(uint)(ABS(fVar273) < fVar316 && bVar24);
      iVar58 = movmskps(iVar58,auVar313);
      if (iVar58 != 0) {
        uVar76 = -(uint)(fVar274 <= 0.0);
        uVar77 = -(uint)(fVar279 <= 0.0);
        uVar78 = -(uint)(fVar280 <= 0.0);
        uVar79 = -(uint)(fVar283 <= 0.0);
        auVar215._0_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar313._0_4_;
        auVar215._4_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar313._4_4_;
        auVar215._8_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar313._8_4_;
        auVar215._12_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar313._12_4_;
        auVar139._0_4_ = ~auVar313._0_4_ & auVar324._0_4_;
        auVar139._4_4_ = ~auVar313._4_4_ & auVar324._4_4_;
        auVar139._8_4_ = ~auVar313._8_4_ & auVar324._8_4_;
        auVar139._12_4_ = ~auVar313._12_4_ & auVar324._12_4_;
        auVar325._0_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar313._0_4_;
        auVar325._4_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar313._4_4_;
        auVar325._8_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar313._8_4_;
        auVar325._12_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar313._12_4_;
        auVar314._0_4_ = ~auVar313._0_4_ & auVar257._0_4_;
        auVar314._4_4_ = ~auVar313._4_4_ & auVar257._4_4_;
        auVar314._8_4_ = ~auVar313._8_4_ & auVar257._8_4_;
        auVar314._12_4_ = ~auVar313._12_4_ & auVar257._12_4_;
        auVar214._4_4_ = -(uint)((fVar308 <= ABS(fVar253) || fVar279 <= 0.0) && bVar22);
        auVar214._0_4_ = -(uint)((fVar306 <= ABS(fVar239) || fVar274 <= 0.0) && bVar74);
        auVar214._8_4_ = -(uint)((fVar311 <= ABS(fVar260) || fVar280 <= 0.0) && bVar23);
        auVar214._12_4_ = -(uint)((fVar316 <= ABS(fVar273) || fVar283 <= 0.0) && bVar24);
        auVar257 = auVar314 | auVar325;
        auVar324 = auVar139 | auVar215;
      }
    }
    auVar26._4_4_ = fVar124;
    auVar26._0_4_ = fVar124;
    auVar26._8_4_ = fVar124;
    auVar26._12_4_ = fVar124;
    auVar216._0_4_ = (auVar214._0_4_ << 0x1f) >> 0x1f;
    auVar216._4_4_ = (auVar214._4_4_ << 0x1f) >> 0x1f;
    auVar216._8_4_ = (auVar214._8_4_ << 0x1f) >> 0x1f;
    auVar216._12_4_ = (auVar214._12_4_ << 0x1f) >> 0x1f;
    auVar216 = auVar216 & local_1f8;
    iVar58 = movmskps(iVar58,auVar216);
    if (iVar58 != 0) {
      local_268 = fVar81;
      fStack_264 = fVar122;
      fStack_260 = fVar123;
      fStack_25c = fVar152;
      local_258 = fVar196;
      fStack_254 = fVar222;
      fStack_250 = fVar223;
      fStack_24c = fVar224;
      local_2d8 = fVar239;
      fStack_2d4 = fVar253;
      fStack_2d0 = fVar260;
      fStack_2cc = fVar273;
      local_2c8 = fVar153;
      fStack_2c4 = fVar154;
      fStack_2c0 = fVar166;
      fStack_2bc = fVar168;
      auVar248._0_4_ = (ray->org).field_0.m128[3] - (float)local_308._0_4_;
      auVar248._4_4_ = auVar248._0_4_;
      auVar248._8_4_ = auVar248._0_4_;
      auVar248._12_4_ = auVar248._0_4_;
      auVar265 = maxps(auVar248,auVar324);
      auVar157._0_4_ = ray->tfar - (float)local_308._0_4_;
      auVar157._4_4_ = auVar157._0_4_;
      auVar157._8_4_ = auVar157._0_4_;
      auVar157._12_4_ = auVar157._0_4_;
      auVar156 = minps(auVar157,auVar257);
      auVar266._0_4_ = local_3a8 * local_318 + local_3b8 * local_468 + local_3c8 * fVar124;
      auVar266._4_4_ = fStack_3a4 * fStack_314 + fStack_3b4 * fStack_464 + fStack_3c4 * fVar124;
      auVar266._8_4_ = fStack_3a0 * fStack_310 + fStack_3b0 * fStack_460 + fStack_3c0 * fVar124;
      auVar266._12_4_ = fStack_39c * fStack_30c + fStack_3ac * fStack_45c + fStack_3bc * fVar124;
      auVar82 = rcpps(auVar26,auVar266);
      fVar274 = auVar82._0_4_;
      fVar279 = auVar82._4_4_;
      fVar280 = auVar82._8_4_;
      fVar283 = auVar82._12_4_;
      fVar238 = ((1.0 - auVar266._0_4_ * fVar274) * fVar274 + fVar274) *
                -(fVar310 * local_3a8 + fVar238 * local_3b8 + (float)local_438._0_4_ * local_3c8);
      fVar240 = ((1.0 - auVar266._4_4_ * fVar279) * fVar279 + fVar279) *
                -(fVar255 * fStack_3a4 + fVar240 * fStack_3b4 + (float)local_438._4_4_ * fStack_3c4)
      ;
      fVar254 = ((1.0 - auVar266._8_4_ * fVar280) * fVar280 + fVar280) *
                -(fVar258 * fStack_3a0 + fVar254 * fStack_3b0 + fStack_430 * fStack_3c0);
      fVar272 = ((1.0 - auVar266._12_4_ * fVar283) * fVar283 + fVar283) *
                -(fVar259 * fStack_39c + fVar272 * fStack_3ac + fStack_42c * fStack_3bc);
      uVar76 = -(uint)(auVar266._0_4_ < 0.0 || ABS(auVar266._0_4_) < 1e-18);
      uVar77 = -(uint)(auVar266._4_4_ < 0.0 || ABS(auVar266._4_4_) < 1e-18);
      uVar78 = -(uint)(auVar266._8_4_ < 0.0 || ABS(auVar266._8_4_) < 1e-18);
      uVar79 = -(uint)(auVar266._12_4_ < 0.0 || ABS(auVar266._12_4_) < 1e-18);
      auVar187._0_8_ = CONCAT44(uVar77,uVar76) & 0xff800000ff800000;
      auVar187._8_4_ = uVar78 & 0xff800000;
      auVar187._12_4_ = uVar79 & 0xff800000;
      auVar104._0_4_ = ~uVar76 & (uint)fVar238;
      auVar104._4_4_ = ~uVar77 & (uint)fVar240;
      auVar104._8_4_ = ~uVar78 & (uint)fVar254;
      auVar104._12_4_ = ~uVar79 & (uint)fVar272;
      auVar265 = maxps(auVar265,auVar104 | auVar187);
      uVar76 = -(uint)(0.0 < auVar266._0_4_ || ABS(auVar266._0_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar266._4_4_ || ABS(auVar266._4_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar266._8_4_ || ABS(auVar266._8_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar266._12_4_ || ABS(auVar266._12_4_) < 1e-18);
      auVar105._0_8_ = CONCAT44(uVar77,uVar76) & 0x7f8000007f800000;
      auVar105._8_4_ = uVar78 & 0x7f800000;
      auVar105._12_4_ = uVar79 & 0x7f800000;
      auVar267._0_4_ = ~uVar76 & (uint)fVar238;
      auVar267._4_4_ = ~uVar77 & (uint)fVar240;
      auVar267._8_4_ = ~uVar78 & (uint)fVar254;
      auVar267._12_4_ = ~uVar79 & (uint)fVar272;
      auVar156 = minps(auVar156,auVar267 | auVar105);
      auVar140._0_4_ = (0.0 - fVar320) * -fStack_3b4 + (0.0 - fVar282) * -fStack_3c4;
      auVar140._4_4_ = (0.0 - fVar321) * -fStack_3b0 + (0.0 - fVar307) * -fStack_3c0;
      auVar140._8_4_ = (0.0 - fVar322) * -fStack_3ac + (0.0 - fVar309) * -fStack_3bc;
      auVar140._12_4_ = 0x80000000;
      auVar268._0_4_ = -fStack_3a4 * local_318 + -fStack_3b4 * local_468 + -fStack_3c4 * fVar124;
      auVar268._4_4_ = -fStack_3a0 * fStack_314 + -fStack_3b0 * fStack_464 + -fStack_3c0 * fVar124;
      auVar268._8_4_ = -fStack_39c * fStack_310 + -fStack_3ac * fStack_460 + -fStack_3bc * fVar124;
      auVar268._12_4_ = fStack_30c * -0.0 + fStack_45c * -0.0 + fVar124 * -0.0;
      auVar82 = rcpps(auVar140,auVar268);
      fVar238 = auVar82._0_4_;
      fVar240 = auVar82._4_4_;
      fVar254 = auVar82._8_4_;
      fVar272 = auVar82._12_4_;
      fVar238 = (((float)DAT_01f7ba10 - auVar268._0_4_ * fVar238) * fVar238 + fVar238) *
                -((0.0 - fStack_4c4) * -fStack_3a4 + auVar140._0_4_);
      fVar240 = ((DAT_01f7ba10._4_4_ - auVar268._4_4_ * fVar240) * fVar240 + fVar240) *
                -((0.0 - fStack_4c0) * -fStack_3a0 + auVar140._4_4_);
      fVar254 = ((DAT_01f7ba10._8_4_ - auVar268._8_4_ * fVar254) * fVar254 + fVar254) *
                -((0.0 - fStack_4bc) * -fStack_39c + auVar140._8_4_);
      fVar272 = ((DAT_01f7ba10._12_4_ - auVar268._12_4_ * fVar272) * fVar272 + fVar272) * 0.0;
      uVar76 = -(uint)(auVar268._0_4_ < 0.0 || ABS(auVar268._0_4_) < 1e-18);
      uVar77 = -(uint)(auVar268._4_4_ < 0.0 || ABS(auVar268._4_4_) < 1e-18);
      uVar78 = -(uint)(auVar268._8_4_ < 0.0 || ABS(auVar268._8_4_) < 1e-18);
      uVar79 = -(uint)(auVar268._12_4_ < 0.0 || ABS(auVar268._12_4_) < 1e-18);
      auVar141._0_8_ = CONCAT44(uVar77,uVar76) & 0xff800000ff800000;
      auVar141._8_4_ = uVar78 & 0xff800000;
      auVar141._12_4_ = uVar79 & 0xff800000;
      auVar106._0_4_ = ~uVar76 & (uint)fVar238;
      auVar106._4_4_ = ~uVar77 & (uint)fVar240;
      auVar106._8_4_ = ~uVar78 & (uint)fVar254;
      auVar106._12_4_ = ~uVar79 & (uint)fVar272;
      auVar82 = maxps(auVar265,auVar106 | auVar141);
      uVar76 = -(uint)(0.0 < auVar268._0_4_ || ABS(auVar268._0_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar268._4_4_ || ABS(auVar268._4_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar268._8_4_ || ABS(auVar268._8_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar268._12_4_ || ABS(auVar268._12_4_) < 1e-18);
      auVar107._0_8_ = CONCAT44(uVar77,uVar76) & 0x7f8000007f800000;
      auVar107._8_4_ = uVar78 & 0x7f800000;
      auVar107._12_4_ = uVar79 & 0x7f800000;
      auVar269._0_4_ = ~uVar76 & (uint)fVar238;
      auVar269._4_4_ = ~uVar77 & (uint)fVar240;
      auVar269._8_4_ = ~uVar78 & (uint)fVar254;
      auVar269._12_4_ = ~uVar79 & (uint)fVar272;
      auVar156 = minps(auVar156,auVar269 | auVar107);
      fVar238 = auVar82._12_4_;
      fVar240 = auVar82._0_4_;
      fVar254 = auVar82._4_4_;
      fVar272 = auVar82._8_4_;
      auVar315._0_4_ = -(uint)(fVar240 <= auVar156._0_4_) & auVar216._0_4_;
      auVar315._4_4_ = -(uint)(fVar254 <= auVar156._4_4_) & auVar216._4_4_;
      auVar315._8_4_ = -(uint)(fVar272 <= auVar156._8_4_) & auVar216._8_4_;
      auVar315._12_4_ = -(uint)(fVar238 <= auVar156._12_4_) & auVar216._12_4_;
      iVar58 = movmskps(iVar58,auVar315);
      if (iVar58 != 0) {
        auVar265 = maxps(ZEXT816(0),_local_4f8);
        auVar35._4_4_ = fStack_204;
        auVar35._0_4_ = local_208;
        auVar35._8_4_ = fStack_200;
        auVar35._12_4_ = fStack_1fc;
        auVar291 = minps(auVar35,_DAT_01f7ba10);
        auVar188._0_12_ = ZEXT812(0);
        auVar188._12_4_ = 0.0;
        auVar249 = maxps(auVar291,auVar188);
        auVar291 = minps(_local_478,_DAT_01f7ba10);
        auVar291 = maxps(auVar291,auVar188);
        local_108._0_4_ = (auVar249._0_4_ + 0.0) * 0.25 * local_448 + local_1e8;
        local_108._4_4_ = (auVar249._4_4_ + 1.0) * 0.25 * local_448 + local_1e8;
        local_108._8_4_ = (auVar249._8_4_ + 2.0) * 0.25 * local_448 + local_1e8;
        local_108._12_4_ = (auVar249._12_4_ + 3.0) * 0.25 * local_448 + local_1e8;
        local_118[0] = (auVar291._0_4_ + 0.0) * 0.25 * local_448 + local_1e8;
        local_118[1] = (auVar291._4_4_ + 1.0) * 0.25 * local_448 + local_1e8;
        local_118[2] = (auVar291._8_4_ + 2.0) * 0.25 * local_448 + local_1e8;
        local_118[3] = (auVar291._12_4_ + 3.0) * 0.25 * local_448 + local_1e8;
        auVar142._0_4_ = fVar292 - auVar265._0_4_ * auVar265._0_4_;
        auVar142._4_4_ = fVar294 - auVar265._4_4_ * auVar265._4_4_;
        auVar142._8_4_ = fVar296 - auVar265._8_4_ * auVar265._8_4_;
        auVar142._12_4_ = fVar298 - auVar265._12_4_ * auVar265._12_4_;
        auVar176._0_4_ = local_1d8 * local_1d8 - (float)local_508._0_4_ * auVar142._0_4_;
        auVar176._4_4_ = fStack_1d4 * fStack_1d4 - (float)local_508._4_4_ * auVar142._4_4_;
        auVar176._8_4_ = fStack_1d0 * fStack_1d0 - fStack_500 * auVar142._8_4_;
        auVar176._12_4_ = fStack_1cc * fStack_1cc - fStack_4fc * auVar142._12_4_;
        local_478._4_4_ = -(uint)(0.0 <= auVar176._4_4_);
        local_478._0_4_ = -(uint)(0.0 <= auVar176._0_4_);
        fStack_470 = (float)-(uint)(0.0 <= auVar176._8_4_);
        fStack_46c = (float)-(uint)(0.0 <= auVar176._12_4_);
        iVar58 = movmskps(iVar58,_local_478);
        if (iVar58 == 0) {
          _local_588 = ZEXT816(0);
          fVar196 = 0.0;
          fVar222 = 0.0;
          fVar223 = 0.0;
          fVar224 = 0.0;
          fVar310 = 0.0;
          fVar255 = 0.0;
          fVar258 = 0.0;
          fVar259 = 0.0;
          fVar274 = 0.0;
          fVar279 = 0.0;
          fVar280 = 0.0;
          fVar283 = 0.0;
          _local_4f8 = ZEXT816(0);
          iVar58 = 0;
          auVar143 = _DAT_01f7aa00;
          auVar177 = _DAT_01f7a9f0;
        }
        else {
          auVar291 = sqrtps(local_108,auVar176);
          auVar108._0_4_ = fVar239 + fVar239;
          auVar108._4_4_ = fVar253 + fVar253;
          auVar108._8_4_ = fVar260 + fVar260;
          auVar108._12_4_ = fVar273 + fVar273;
          auVar265 = rcpps(auVar142,auVar108);
          fVar292 = auVar265._0_4_;
          fVar294 = auVar265._4_4_;
          fVar296 = auVar265._8_4_;
          fVar298 = auVar265._12_4_;
          fVar292 = ((float)DAT_01f7ba10 - auVar108._0_4_ * fVar292) * fVar292 + fVar292;
          fVar294 = (DAT_01f7ba10._4_4_ - auVar108._4_4_ * fVar294) * fVar294 + fVar294;
          fVar296 = (DAT_01f7ba10._8_4_ - auVar108._8_4_ * fVar296) * fVar296 + fVar296;
          fVar298 = (DAT_01f7ba10._12_4_ - auVar108._12_4_ * fVar298) * fVar298 + fVar298;
          fVar317 = (-local_1d8 - auVar291._0_4_) * fVar292;
          fVar318 = (-fStack_1d4 - auVar291._4_4_) * fVar294;
          fVar281 = (-fStack_1d0 - auVar291._8_4_) * fVar296;
          fVar284 = (-fStack_1cc - auVar291._12_4_) * fVar298;
          fVar292 = (auVar291._0_4_ - local_1d8) * fVar292;
          fVar294 = (auVar291._4_4_ - fStack_1d4) * fVar294;
          fVar296 = (auVar291._8_4_ - fStack_1d0) * fVar296;
          fVar298 = (auVar291._12_4_ - fStack_1cc) * fVar298;
          fVar306 = (fVar196 * fVar317 + (float)local_4d8._0_4_) * fVar153;
          fVar308 = (fVar222 * fVar318 + (float)local_4d8._4_4_) * fVar154;
          fVar311 = (fVar223 * fVar281 + fStack_4d0) * fVar166;
          fVar316 = (fVar224 * fVar284 + fStack_4cc) * fVar168;
          fVar310 = local_318 * fVar317 - (local_348 * fVar306 + local_4c8);
          fVar255 = fStack_314 * fVar318 - (fStack_344 * fVar308 + fStack_4c4);
          fVar258 = fStack_310 * fVar281 - (fStack_340 * fVar311 + fStack_4c0);
          fVar259 = fStack_30c * fVar284 - (fStack_33c * fVar316 + fStack_4bc);
          fVar274 = local_468 * fVar317 - ((float)local_328._0_4_ * fVar306 + fVar319);
          fVar279 = fStack_464 * fVar318 - ((float)local_328._4_4_ * fVar308 + fVar320);
          fVar280 = fStack_460 * fVar281 - (fStack_320 * fVar311 + fVar321);
          fVar283 = fStack_45c * fVar284 - (fStack_31c * fVar316 + fVar322);
          local_4f8._4_4_ = fVar124 * fVar318 - (fVar308 * (float)local_338._4_4_ + fVar282);
          local_4f8._0_4_ = fVar124 * fVar317 - (fVar306 * (float)local_338._0_4_ + fVar305);
          fStack_4f0 = fVar124 * fVar281 - (fVar311 * fStack_330 + fVar307);
          fStack_4ec = fVar124 * fVar284 - (fVar316 * fStack_32c + fVar309);
          fVar153 = (fVar196 * fVar292 + (float)local_4d8._0_4_) * fVar153;
          fVar154 = (fVar222 * fVar294 + (float)local_4d8._4_4_) * fVar154;
          fVar166 = (fVar223 * fVar296 + fStack_4d0) * fVar166;
          fVar168 = (fVar224 * fVar298 + fStack_4cc) * fVar168;
          local_588._4_4_ = fStack_314 * fVar294 - (fStack_344 * fVar154 + fStack_4c4);
          local_588._0_4_ = local_318 * fVar292 - (local_348 * fVar153 + local_4c8);
          fStack_580 = fStack_310 * fVar296 - (fStack_340 * fVar166 + fStack_4c0);
          fStack_57c = fStack_30c * fVar298 - (fStack_33c * fVar168 + fStack_4bc);
          fVar196 = local_468 * fVar292 - ((float)local_328._0_4_ * fVar153 + fVar319);
          fVar222 = fStack_464 * fVar294 - ((float)local_328._4_4_ * fVar154 + fVar320);
          fVar223 = fStack_460 * fVar296 - (fStack_320 * fVar166 + fVar321);
          fVar224 = fStack_45c * fVar298 - (fStack_31c * fVar168 + fVar322);
          bVar74 = 0.0 <= auVar176._0_4_;
          uVar76 = -(uint)bVar74;
          bVar22 = 0.0 <= auVar176._4_4_;
          uVar77 = -(uint)bVar22;
          bVar23 = 0.0 <= auVar176._8_4_;
          uVar78 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar176._12_4_;
          uVar79 = -(uint)bVar24;
          auVar188._0_4_ = fVar124 * fVar292 - (fVar153 * (float)local_338._0_4_ + fVar305);
          auVar188._4_4_ = fVar124 * fVar294 - (fVar154 * (float)local_338._4_4_ + fVar282);
          auVar188._8_4_ = fVar124 * fVar296 - (fVar166 * fStack_330 + fVar307);
          auVar188._12_4_ = fVar124 * fVar298 - (fVar168 * fStack_32c + fVar309);
          auVar230._0_4_ = (uint)fVar317 & uVar76;
          auVar230._4_4_ = (uint)fVar318 & uVar77;
          auVar230._8_4_ = (uint)fVar281 & uVar78;
          auVar230._12_4_ = (uint)fVar284 & uVar79;
          auVar177._0_8_ = CONCAT44(~uVar77,~uVar76) & 0x7f8000007f800000;
          auVar177._8_4_ = ~uVar78 & 0x7f800000;
          auVar177._12_4_ = ~uVar79 & 0x7f800000;
          auVar177 = auVar177 | auVar230;
          auVar250._0_4_ = (uint)fVar292 & uVar76;
          auVar250._4_4_ = (uint)fVar294 & uVar77;
          auVar250._8_4_ = (uint)fVar296 & uVar78;
          auVar250._12_4_ = (uint)fVar298 & uVar79;
          auVar143._0_8_ = CONCAT44(~uVar77,~uVar76) & 0xff800000ff800000;
          auVar143._8_4_ = ~uVar78 & 0xff800000;
          auVar143._12_4_ = ~uVar79 & 0xff800000;
          auVar143 = auVar143 | auVar250;
          auVar217._0_8_ = CONCAT44(fVar122,fVar81) & 0x7fffffff7fffffff;
          auVar217._8_4_ = ABS(fVar123);
          auVar217._12_4_ = ABS(fVar152);
          auVar34._4_4_ = fStack_2b4;
          auVar34._0_4_ = local_2b8;
          auVar34._8_4_ = fStack_2b0;
          auVar34._12_4_ = fStack_2ac;
          auVar265 = maxps(auVar34,auVar217);
          fVar81 = auVar265._0_4_ * 1.9073486e-06;
          fVar122 = auVar265._4_4_ * 1.9073486e-06;
          fVar123 = auVar265._8_4_ * 1.9073486e-06;
          fVar152 = auVar265._12_4_ * 1.9073486e-06;
          auVar218._0_4_ = -(uint)(ABS(fVar239) < fVar81 && bVar74);
          auVar218._4_4_ = -(uint)(ABS(fVar253) < fVar122 && bVar22);
          auVar218._8_4_ = -(uint)(ABS(fVar260) < fVar123 && bVar23);
          auVar218._12_4_ = -(uint)(ABS(fVar273) < fVar152 && bVar24);
          iVar58 = movmskps(iVar58,auVar218);
          if (iVar58 != 0) {
            uVar76 = -(uint)(auVar142._0_4_ <= 0.0);
            uVar77 = -(uint)(auVar142._4_4_ <= 0.0);
            uVar78 = -(uint)(auVar142._8_4_ <= 0.0);
            uVar79 = -(uint)(auVar142._12_4_ <= 0.0);
            auVar270._0_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar218._0_4_;
            auVar270._4_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar218._4_4_;
            auVar270._8_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar218._8_4_;
            auVar270._12_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar218._12_4_;
            auVar251._0_4_ = ~auVar218._0_4_ & auVar177._0_4_;
            auVar251._4_4_ = ~auVar218._4_4_ & auVar177._4_4_;
            auVar251._8_4_ = ~auVar218._8_4_ & auVar177._8_4_;
            auVar251._12_4_ = ~auVar218._12_4_ & auVar177._12_4_;
            auVar271._0_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar218._0_4_;
            auVar271._4_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar218._4_4_;
            auVar271._8_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar218._8_4_;
            auVar271._12_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar218._12_4_;
            auVar219._0_4_ = ~auVar218._0_4_ & auVar143._0_4_;
            auVar219._4_4_ = ~auVar218._4_4_ & auVar143._4_4_;
            auVar219._8_4_ = ~auVar218._8_4_ & auVar143._8_4_;
            auVar219._12_4_ = ~auVar218._12_4_ & auVar143._12_4_;
            local_478._4_4_ = -(uint)((fVar122 <= ABS(fVar253) || auVar142._4_4_ <= 0.0) && bVar22);
            local_478._0_4_ = -(uint)((fVar81 <= ABS(fVar239) || auVar142._0_4_ <= 0.0) && bVar74);
            fStack_470 = (float)-(uint)((fVar123 <= ABS(fVar260) || auVar142._8_4_ <= 0.0) && bVar23
                                       );
            fStack_46c = (float)-(uint)((fVar152 <= ABS(fVar273) || auVar142._12_4_ <= 0.0) &&
                                       bVar24);
            auVar143 = auVar219 | auVar271;
            auVar177 = auVar251 | auVar270;
          }
        }
        fVar81 = (ray->dir).field_0.m128[0];
        fVar122 = (ray->dir).field_0.m128[1];
        fVar123 = (ray->dir).field_0.m128[2];
        _local_138 = auVar82;
        local_128 = minps(auVar156,auVar177);
        _local_298 = maxps(auVar82,auVar143);
        local_288 = auVar156;
        auVar231._0_4_ = -(uint)(fVar240 <= local_128._0_4_) & auVar315._0_4_;
        auVar231._4_4_ = -(uint)(fVar254 <= local_128._4_4_) & auVar315._4_4_;
        auVar231._8_4_ = -(uint)(fVar272 <= local_128._8_4_) & auVar315._8_4_;
        auVar231._12_4_ = -(uint)(fVar238 <= local_128._12_4_) & auVar315._12_4_;
        fVar166 = local_298._12_4_;
        fVar152 = local_298._0_4_;
        fVar153 = local_298._4_4_;
        fVar154 = local_298._8_4_;
        auVar144._0_8_ =
             CONCAT44(-(uint)(fVar153 <= auVar156._4_4_) & auVar315._4_4_,
                      -(uint)(fVar152 <= auVar156._0_4_) & auVar315._0_4_);
        auVar144._8_4_ = -(uint)(fVar154 <= auVar156._8_4_) & auVar315._8_4_;
        auVar144._12_4_ = -(uint)(fVar166 <= auVar156._12_4_) & auVar315._12_4_;
        auVar158._8_4_ = auVar144._8_4_;
        auVar158._0_8_ = auVar144._0_8_;
        auVar158._12_4_ = auVar144._12_4_;
        iVar58 = movmskps(iVar58,auVar158 | auVar231);
        if (iVar58 != 0) {
          _local_338 = auVar144;
          local_348 = fVar167;
          fStack_344 = fVar167;
          fStack_340 = fVar167;
          fStack_33c = fVar167;
          local_4f8._0_4_ =
               -(uint)((int)fVar167 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._0_4_ * fVar123 +
                                                 fVar274 * fVar122 + fVar310 * fVar81)) &
                             local_478._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4f8._4_4_ =
               -(uint)((int)fVar167 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._4_4_ * fVar123 +
                                                 fVar279 * fVar122 + fVar255 * fVar81)) &
                             local_478._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4f0 = (float)-(uint)((int)fVar167 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4f0 * fVar123 +
                                                                fVar280 * fVar122 + fVar258 * fVar81
                                                               )) & (uint)fStack_470) << 0x1f) >>
                                     0x1f) + 4);
          fStack_4ec = (float)-(uint)((int)fVar167 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4ec * fVar123 +
                                                                fVar283 * fVar122 + fVar259 * fVar81
                                                               )) & (uint)fStack_46c) << 0x1f) >>
                                     0x1f) + 4);
          _local_328 = auVar231;
          local_2f8 = ~_local_4f8 & auVar231;
          iVar58 = movmskps(iVar58,local_2f8);
          if (iVar58 == 0) {
            fVar168 = ray->tfar;
            auVar252._4_4_ = fVar184;
            auVar252._0_4_ = fVar183;
            auVar252._8_4_ = fVar185;
            auVar252._12_4_ = fVar194;
            fVar238 = fVar152;
            fVar239 = fVar153;
            fVar240 = fVar154;
            fVar253 = fVar166;
          }
          else {
            local_458 = local_4e8 + fVar240;
            fStack_454 = fStack_4e4 + fVar254;
            fStack_450 = fStack_4e0 + fVar272;
            fStack_44c = fStack_4dc + fVar238;
            auVar252._4_4_ = fVar184;
            auVar252._0_4_ = fVar183;
            auVar252._8_4_ = fVar185;
            auVar252._12_4_ = fVar194;
            _local_508 = _local_298;
            do {
              auVar265 = ~local_2f8 & _DAT_01f7a9f0 | local_2f8 & auVar82;
              auVar178._4_4_ = auVar265._0_4_;
              auVar178._0_4_ = auVar265._4_4_;
              auVar178._8_4_ = auVar265._12_4_;
              auVar178._12_4_ = auVar265._8_4_;
              auVar156 = minps(auVar178,auVar265);
              auVar109._0_8_ = auVar156._8_8_;
              auVar109._8_4_ = auVar156._0_4_;
              auVar109._12_4_ = auVar156._4_4_;
              auVar156 = minps(auVar109,auVar156);
              auVar110._0_8_ =
                   CONCAT44(-(uint)(auVar156._4_4_ == auVar265._4_4_) & local_2f8._4_4_,
                            -(uint)(auVar156._0_4_ == auVar265._0_4_) & local_2f8._0_4_);
              auVar110._8_4_ = -(uint)(auVar156._8_4_ == auVar265._8_4_) & local_2f8._8_4_;
              auVar110._12_4_ = -(uint)(auVar156._12_4_ == auVar265._12_4_) & local_2f8._12_4_;
              iVar58 = movmskps(iVar58,auVar110);
              auVar145 = local_2f8;
              if (iVar58 != 0) {
                auVar145._8_4_ = auVar110._8_4_;
                auVar145._0_8_ = auVar110._0_8_;
                auVar145._12_4_ = auVar110._12_4_;
              }
              uVar59 = movmskps(iVar58,auVar145);
              lVar21 = 0;
              if (CONCAT44(uVar65,uVar59) != 0) {
                for (; (CONCAT44(uVar65,uVar59) >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              *(undefined4 *)(local_2f8 + lVar21 * 4) = 0;
              fVar152 = (ray->dir).field_0.m128[0];
              fVar153 = (ray->dir).field_0.m128[1];
              fVar154 = (ray->dir).field_0.m128[2];
              fVar166 = (ray->dir).field_0.m128[3];
              auVar27._4_4_ = fStack_4b4;
              auVar27._0_4_ = local_4b8;
              auVar27._8_4_ = fStack_4b0;
              auVar27._12_4_ = fStack_4ac;
              auVar265 = minps(_local_578,auVar27);
              auVar291 = maxps(_local_578,auVar27);
              auVar31._4_4_ = fStack_354;
              auVar31._0_4_ = local_358;
              auVar31._8_4_ = fStack_350;
              auVar31._12_4_ = fStack_34c;
              auVar156 = minps(auVar31,auVar252);
              auVar265 = minps(auVar265,auVar156);
              auVar156 = maxps(auVar31,auVar252);
              auVar156 = maxps(auVar291,auVar156);
              auVar159._0_8_ = auVar265._0_8_ & 0x7fffffff7fffffff;
              auVar159._8_4_ = auVar265._8_4_ & 0x7fffffff;
              auVar159._12_4_ = auVar265._12_4_ & 0x7fffffff;
              local_448 = auVar156._12_4_;
              auVar111._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar111._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar111._12_4_ = ABS(local_448);
              auVar156 = maxps(auVar159,auVar111);
              fVar168 = auVar156._4_4_;
              if (auVar156._4_4_ <= auVar156._0_4_) {
                fVar168 = auVar156._0_4_;
              }
              auVar160._8_8_ = auVar156._8_8_;
              auVar160._0_8_ = auVar156._8_8_;
              if (auVar156._8_4_ <= fVar168) {
                auVar160._0_4_ = fVar168;
              }
              register0x00001284 = auVar160._4_12_;
              local_3e8._0_4_ = auVar160._0_4_ * 1.9073486e-06;
              local_3d8._0_4_ =
                   SQRT(fVar154 * fVar154 + fVar153 * fVar153 + fVar152 * fVar152) * 1.9073486e-06;
              fStack_444 = local_448;
              fStack_440 = local_448;
              fStack_43c = local_448;
              fVar168 = *(float *)(local_108 + lVar21 * 4);
              fVar238 = *(float *)(local_138 + lVar21 * 4);
              bVar74 = true;
              uVar68 = 0;
              do {
                fVar239 = 1.0 - fVar168;
                fVar253 = local_4b8 * fVar239 + local_358 * fVar168;
                fVar254 = fStack_4b4 * fVar239 + fStack_354 * fVar168;
                fVar260 = fStack_4b0 * fVar239 + fStack_350 * fVar168;
                fVar273 = fStack_4ac * fVar239 + fStack_34c * fVar168;
                fVar272 = ((float)local_578._0_4_ * fVar239 + local_4b8 * fVar168) * fVar239 +
                          fVar168 * fVar253;
                fVar310 = ((float)local_578._4_4_ * fVar239 + fStack_4b4 * fVar168) * fVar239 +
                          fVar168 * fVar254;
                fVar255 = (fStack_570 * fVar239 + fStack_4b0 * fVar168) * fVar239 +
                          fVar168 * fVar260;
                fVar240 = (fStack_56c * fVar239 + fStack_4ac * fVar168) * fVar239 +
                          fVar168 * fVar273;
                fVar274 = fVar253 * fVar239 +
                          (local_358 * fVar239 + auVar252._0_4_ * fVar168) * fVar168;
                fVar279 = fVar254 * fVar239 +
                          (fStack_354 * fVar239 + auVar252._4_4_ * fVar168) * fVar168;
                fVar280 = fVar260 * fVar239 +
                          (fStack_350 * fVar239 + auVar252._8_4_ * fVar168) * fVar168;
                fVar253 = fVar273 * fVar239 +
                          (fStack_34c * fVar239 + auVar252._12_4_ * fVar168) * fVar168;
                fVar259 = fVar239 * fVar240 + fVar168 * fVar253;
                local_4c8 = (fVar274 - fVar272) * 3.0;
                fStack_4c4 = (fVar279 - fVar310) * 3.0;
                fStack_4c0 = (fVar280 - fVar255) * 3.0;
                fStack_4bc = (fVar253 - fVar240) * 3.0;
                fVar240 = fVar239 * 6.0;
                fVar273 = (fVar168 - (fVar239 + fVar239)) * 6.0;
                fVar258 = (fVar239 - (fVar168 + fVar168)) * 6.0;
                fVar260 = fVar168 * 6.0;
                fVar253 = fVar240 * (float)local_578._0_4_ +
                          fVar273 * local_4b8 + fVar258 * local_358 + fVar260 * auVar252._0_4_;
                fVar254 = fVar240 * (float)local_578._4_4_ +
                          fVar273 * fStack_4b4 + fVar258 * fStack_354 + fVar260 * auVar252._4_4_;
                fVar240 = fVar240 * fStack_570 +
                          fVar273 * fStack_4b0 + fVar258 * fStack_350 + fVar260 * auVar252._8_4_;
                local_408 = (fVar238 * fVar152 + 0.0) - (fVar239 * fVar272 + fVar168 * fVar274);
                fStack_404 = (fVar238 * fVar153 + 0.0) - (fVar239 * fVar310 + fVar168 * fVar279);
                fStack_400 = (fVar238 * fVar154 + 0.0) - (fVar239 * fVar255 + fVar168 * fVar280);
                fStack_3fc = (fVar238 * fVar166 + 0.0) - fVar259;
                fVar239 = fStack_404 * fStack_404;
                fStack_3f0 = fStack_400 * fStack_400;
                fStack_3ec = fStack_3fc * fStack_3fc;
                local_3f8._0_4_ = fVar239 + local_408 * local_408 + fStack_3f0;
                local_3f8._4_4_ = fVar239 + fVar239 + fStack_3ec;
                fStack_3f0 = fVar239 + fStack_3f0 + fStack_3f0;
                fStack_3ec = fVar239 + fStack_3ec + fStack_3ec;
                local_3c8 = (float)local_3e8._0_4_;
                if ((float)local_3e8._0_4_ <= (float)local_3d8._0_4_ * fVar238) {
                  local_3c8 = (float)local_3d8._0_4_ * fVar238;
                }
                fVar273 = fStack_4c4 * fStack_4c4 + local_4c8 * local_4c8 + fStack_4c0 * fStack_4c0;
                auVar156 = ZEXT416((uint)fVar273);
                auVar265 = rsqrtss(ZEXT416((uint)fVar273),auVar156);
                fVar239 = auVar265._0_4_;
                fVar310 = fVar239 * 1.5 - fVar239 * fVar239 * fVar273 * 0.5 * fVar239;
                fVar280 = local_4c8 * fVar310;
                fVar283 = fStack_4c4 * fVar310;
                fVar292 = fStack_4c0 * fVar310;
                fVar294 = fStack_4bc * fVar310;
                fVar274 = fStack_4c0 * fVar240 + fStack_4c4 * fVar254 + local_4c8 * fVar253;
                auVar156 = rcpss(auVar156,auVar156);
                fVar272 = (2.0 - fVar273 * auVar156._0_4_) * auVar156._0_4_;
                fVar260 = fStack_404 * fVar283;
                fVar255 = fStack_400 * fVar292;
                fVar258 = fStack_3fc * fVar294;
                fVar239 = fVar260 + local_408 * fVar280 + fVar255;
                fVar279 = fVar260 + fVar260 + fVar258;
                fVar255 = fVar260 + fVar255 + fVar255;
                fVar258 = fVar260 + fVar258 + fVar258;
                fStack_3c4 = (float)local_3e8._4_4_;
                fStack_3c0 = fStack_3e0;
                fStack_3bc = fStack_3dc;
                local_3a8 = (SQRT((float)local_3f8._0_4_) + 1.0) *
                            ((float)local_3e8._0_4_ / SQRT(fVar273)) +
                            SQRT((float)local_3f8._0_4_) * (float)local_3e8._0_4_ + local_3c8;
                fVar260 = fVar166 * fVar294;
                auVar326._0_4_ = fVar280 * -local_4c8;
                auVar326._4_4_ = fVar283 * -fStack_4c4;
                auVar326._8_4_ = fVar292 * -fStack_4c0;
                auVar326._12_4_ = fVar294 * -fStack_4bc;
                auVar327._8_8_ = auVar326._8_8_;
                auVar327._0_8_ = auVar327._8_8_;
                auVar328._4_12_ = auVar327._4_12_;
                auVar328._0_4_ =
                     auVar326._8_4_ + auVar326._4_4_ + auVar326._0_4_ +
                     fVar272 * (fVar273 * fVar240 - fVar274 * fStack_4c0) * fVar310 * fStack_400 +
                     fVar272 * (fVar273 * fVar254 - fVar274 * fStack_4c4) * fVar310 * fStack_404 +
                     fVar272 * (fVar273 * fVar253 - fVar274 * local_4c8) * fVar310 * local_408;
                fVar240 = fVar154 * fVar292 + fVar153 * fVar283 + fVar152 * fVar280;
                fVar253 = (float)local_3f8._0_4_ - fVar239 * fVar239;
                auVar112._0_8_ = CONCAT44((float)local_3f8._4_4_ - fVar279 * fVar279,fVar253);
                auVar112._8_4_ = fStack_3f0 - fVar255 * fVar255;
                auVar112._12_4_ = fStack_3ec - fVar258 * fVar258;
                fStack_3b0 = -fStack_4c0 * fStack_400;
                fStack_3b4 = -fStack_4bc * fStack_3fc;
                local_3b8 = (fStack_3b0 + -fStack_4c4 * fStack_404 + -local_4c8 * local_408) -
                            fVar239 * auVar328._0_4_;
                fStack_3ac = fStack_3b4;
                auVar232._0_4_ = fVar152 * local_408;
                auVar232._4_4_ = fVar153 * fStack_404;
                auVar232._8_4_ = fVar154 * fStack_400;
                auVar232._12_4_ = fVar166 * fStack_3fc;
                auVar233._8_8_ = auVar232._8_8_;
                auVar233._0_8_ = auVar233._8_8_;
                auVar234._4_12_ = auVar233._4_12_;
                auVar234._0_4_ =
                     (auVar232._8_4_ + auVar232._4_4_ + auVar232._0_4_) - fVar239 * fVar240;
                auVar146._8_4_ = auVar112._8_4_;
                auVar146._0_8_ = auVar112._0_8_;
                auVar146._12_4_ = auVar112._12_4_;
                auVar156 = rsqrtss(auVar146,auVar112);
                fVar254 = auVar156._0_4_;
                fVar254 = fVar254 * 1.5 - fVar254 * fVar254 * fVar253 * 0.5 * fVar254;
                if (fVar253 < 0.0) {
                  local_438._4_4_ = fVar260;
                  local_438._0_4_ = fVar240;
                  fStack_430 = fVar154 * fVar292;
                  fStack_42c = fVar260;
                  _local_4d8 = auVar234;
                  local_428 = fVar239;
                  fStack_424 = fVar279;
                  fStack_420 = fVar255;
                  fStack_41c = fVar258;
                  _local_418 = auVar328;
                  fVar253 = sqrtf(fVar253);
                  auVar323 = local_418;
                  fVar239 = local_428;
                  fVar240 = (float)local_438._0_4_;
                  fVar260 = (float)local_438._4_4_;
                  auVar225 = local_4d8;
                }
                else {
                  fVar253 = SQRT(fVar253);
                  auVar323 = (undefined1  [8])auVar328._0_8_;
                  auVar225 = (undefined1  [8])auVar234._0_8_;
                }
                fVar253 = fVar253 - fVar259;
                fVar272 = local_3b8 * fVar254 - fStack_4bc;
                fVar254 = SUB84(auVar225,0) * fVar254;
                auVar179._0_4_ = SUB84(auVar323,0) * fVar254 - fVar240 * fVar272;
                auVar190._8_4_ = -fStack_3b4;
                auVar190._0_8_ = CONCAT44(fStack_3b4,fVar272) ^ 0x8000000000000000;
                auVar190._12_4_ = (int)((ulong)auVar225 >> 0x20);
                auVar189._8_8_ = auVar190._8_8_;
                auVar189._0_8_ = CONCAT44(fVar254,fVar272) ^ 0x80000000;
                auVar179._4_4_ = auVar179._0_4_;
                auVar179._8_4_ = auVar179._0_4_;
                auVar179._12_4_ = auVar179._0_4_;
                auVar156 = divps(auVar189,auVar179);
                auVar330._8_4_ = (int)((ulong)auVar323 >> 0x20);
                auVar330._0_8_ = auVar323;
                auVar330._12_4_ = -fVar260;
                auVar329._8_8_ = auVar330._8_8_;
                auVar329._0_8_ = CONCAT44(fVar240,SUB84(auVar323,0)) ^ 0x8000000000000000;
                auVar265 = divps(auVar329,auVar179);
                fVar238 = fVar238 - (fVar253 * auVar265._0_4_ + fVar239 * auVar156._0_4_);
                fVar168 = fVar168 - (fVar253 * auVar265._4_4_ + fVar239 * auVar156._4_4_);
                if ((ABS(fVar239) < local_3a8) &&
                   (ABS(fVar253) < local_448 * 1.9073486e-06 + local_3c8 + local_3a8)) {
                  fVar238 = local_308._0_4_ + fVar238;
                  uVar64 = 0;
                  if ((fVar238 < (ray->org).field_0.m128[3]) ||
                     (((fVar152 = ray->tfar, fVar152 < fVar238 || (uVar64 = 0, fVar168 < 0.0)) ||
                      (1.0 < fVar168)))) goto LAB_00b1c41a;
                  auVar156 = rsqrtss(_local_3f8,_local_3f8);
                  fVar153 = auVar156._0_4_;
                  pGVar16 = (context->scene->geometries).items[(long)pRVar67].ptr;
                  pRVar66 = pRVar67;
                  if ((pGVar16->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (uVar64 = CONCAT71((int7)((ulong)context->args >> 8),1),
                       pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b1c41a;
                    fVar239 = fVar153 * 1.5 + fVar153 * fVar153 * local_3f8._0_4_ * -0.5 * fVar153;
                    fVar240 = local_408 * fVar239;
                    fVar254 = fStack_404 * fVar239;
                    fVar239 = fStack_400 * fVar239;
                    fVar153 = fStack_4bc * fVar240 + local_4c8;
                    fVar154 = fStack_4bc * fVar254 + fStack_4c4;
                    fVar166 = fStack_4bc * fVar239 + fStack_4c0;
                    fVar253 = fVar254 * local_4c8 - fStack_4c4 * fVar240;
                    fVar254 = fVar239 * fStack_4c4 - fStack_4c0 * fVar254;
                    fVar239 = fVar240 * fStack_4c0 - local_4c8 * fVar239;
                    local_4a8 = CONCAT44(fVar153 * fVar253 - fVar254 * fVar166,
                                         fVar166 * fVar239 - fVar253 * fVar154);
                    fStack_4a0 = fVar154 * fVar254 - fVar239 * fVar153;
                    fStack_49c = fVar168;
                    local_498 = 0;
                    local_494 = (int)local_388;
                    local_490 = uVar75;
                    local_48c = context->user->instID[0];
                    pRVar66 = (RTCIntersectArguments *)(ulong)local_48c;
                    local_488 = context->user->instPrimID[0];
                    ray->tfar = fVar238;
                    local_398._0_4_ = 0xffffffff;
                    local_538.geometryUserPtr = pGVar16->userPtr;
                    local_538.valid = (int *)local_398;
                    local_538.context = context->user;
                    local_538.hit = (RTCHitN *)&local_4a8;
                    local_538.N = 1;
                    local_538.ray = (RTCRayN *)ray;
                    if (pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b1c636:
                      pRVar66 = context->args;
                      p_Var63 = pRVar66->filter;
                      if ((p_Var63 != (RTCFilterFunctionN)0x0) &&
                         (((pRVar66->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var63)(&local_538);
                        p_Var63 = (RTCFilterFunctionN)local_538.valid;
                        if (*local_538.valid == 0) goto LAB_00b1c677;
                      }
                      uVar64 = CONCAT71((int7)((ulong)p_Var63 >> 8),1);
                      goto LAB_00b1c41a;
                    }
                    (*pGVar16->occlusionFilterN)(&local_538);
                    if (*local_538.valid != 0) goto LAB_00b1c636;
LAB_00b1c677:
                    ray->tfar = fVar152;
                  }
                  uVar64 = 0;
                  goto LAB_00b1c41a;
                }
                bVar74 = uVar68 < 4;
                uVar68 = uVar68 + 1;
              } while (uVar68 != 5);
              bVar74 = false;
              uVar64 = 5;
LAB_00b1c41a:
              fVar168 = ray->tfar;
              local_2f8._0_4_ = -(uint)(local_458 <= fVar168) & local_2f8._0_4_;
              local_2f8._4_4_ = -(uint)(fStack_454 <= fVar168) & local_2f8._4_4_;
              local_2f8._8_4_ = -(uint)(fStack_450 <= fVar168) & local_2f8._8_4_;
              local_2f8._12_4_ = -(uint)(fStack_44c <= fVar168) & local_2f8._12_4_;
              bVar71 = (bool)(bVar71 | bVar74 & (byte)uVar64);
              uVar65 = (undefined4)((ulong)uVar64 >> 0x20);
              iVar58 = movmskps((int)uVar64,local_2f8);
            } while (iVar58 != 0);
            fVar152 = (float)local_508._0_4_;
            fVar153 = (float)local_508._4_4_;
            fVar154 = fStack_500;
            fVar166 = fStack_4fc;
            fVar238 = (float)local_298._0_4_;
            fVar239 = (float)local_298._4_4_;
            fVar240 = fStack_290;
            fVar253 = fStack_28c;
          }
          uVar59 = SUB84(pRVar66,0);
          local_508._0_4_ = -(uint)(fVar152 + local_4e8 <= fVar168) & local_338._0_4_;
          local_508._4_4_ = -(uint)(fVar153 + fStack_4e4 <= fVar168) & local_338._4_4_;
          fStack_500 = (float)(-(uint)(fVar154 + fStack_4e0 <= fVar168) & (uint)fStack_330);
          fStack_4fc = (float)(-(uint)(fVar166 + fStack_4dc <= fVar168) & (uint)fStack_32c);
          auVar148._0_4_ =
               -(uint)((int)local_348 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_588._0_4_ * fVar81 +
                                                 fVar196 * fVar122 + auVar188._0_4_ * fVar123)) &
                             local_478._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar148._4_4_ =
               -(uint)((int)fStack_344 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_588._4_4_ * fVar81 +
                                                 fVar222 * fVar122 + auVar188._4_4_ * fVar123)) &
                             local_478._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar148._8_4_ =
               -(uint)((int)fStack_340 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_580 * fVar81 +
                                                 fVar223 * fVar122 + auVar188._8_4_ * fVar123)) &
                             (uint)fStack_470) << 0x1f) >> 0x1f) + 4);
          auVar148._12_4_ =
               -(uint)((int)fStack_33c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_57c * fVar81 +
                                                 fVar224 * fVar122 + auVar188._12_4_ * fVar123)) &
                             (uint)fStack_46c) << 0x1f) >> 0x1f) + 4);
          local_398 = ~auVar148 & _local_508;
          iVar58 = movmskps(0,local_398);
          if (iVar58 != 0) {
            local_458 = local_4e8 + fVar238;
            fStack_454 = fStack_4e4 + fVar239;
            fStack_450 = fStack_4e0 + fVar240;
            fStack_44c = fStack_4dc + fVar253;
            do {
              uVar76 = local_398._0_4_;
              uVar77 = local_398._4_4_;
              uVar78 = local_398._8_4_;
              uVar79 = local_398._12_4_;
              auVar115._0_4_ = uVar76 & (uint)fVar238;
              auVar115._4_4_ = uVar77 & (uint)fVar239;
              auVar115._8_4_ = uVar78 & (uint)fVar240;
              auVar115._12_4_ = uVar79 & (uint)fVar253;
              auVar163._0_8_ = CONCAT44(~uVar77,~uVar76) & 0x7f8000007f800000;
              auVar163._8_4_ = ~uVar78 & 0x7f800000;
              auVar163._12_4_ = ~uVar79 & 0x7f800000;
              auVar163 = auVar163 | auVar115;
              auVar181._4_4_ = auVar163._0_4_;
              auVar181._0_4_ = auVar163._4_4_;
              auVar181._8_4_ = auVar163._12_4_;
              auVar181._12_4_ = auVar163._8_4_;
              auVar82 = minps(auVar181,auVar163);
              auVar116._0_8_ = auVar82._8_8_;
              auVar116._8_4_ = auVar82._0_4_;
              auVar116._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar116,auVar82);
              auVar117._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar163._4_4_) & uVar77,
                            -(uint)(auVar82._0_4_ == auVar163._0_4_) & uVar76);
              auVar117._8_4_ = -(uint)(auVar82._8_4_ == auVar163._8_4_) & uVar78;
              auVar117._12_4_ = -(uint)(auVar82._12_4_ == auVar163._12_4_) & uVar79;
              iVar58 = movmskps(iVar58,auVar117);
              auVar149 = local_398;
              if (iVar58 != 0) {
                auVar149._8_4_ = auVar117._8_4_;
                auVar149._0_8_ = auVar117._0_8_;
                auVar149._12_4_ = auVar117._12_4_;
              }
              uVar59 = movmskps(iVar58,auVar149);
              lVar21 = 0;
              if (CONCAT44(uVar65,uVar59) != 0) {
                for (; (CONCAT44(uVar65,uVar59) >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              *(undefined4 *)(local_398 + lVar21 * 4) = 0;
              fVar81 = (ray->dir).field_0.m128[0];
              fVar122 = (ray->dir).field_0.m128[1];
              fVar123 = (ray->dir).field_0.m128[2];
              fVar152 = (ray->dir).field_0.m128[3];
              auVar28._4_4_ = fStack_4b4;
              auVar28._0_4_ = local_4b8;
              auVar28._8_4_ = fStack_4b0;
              auVar28._12_4_ = fStack_4ac;
              auVar156 = minps(_local_578,auVar28);
              auVar265 = maxps(_local_578,auVar28);
              auVar32._4_4_ = fStack_354;
              auVar32._0_4_ = local_358;
              auVar32._8_4_ = fStack_350;
              auVar32._12_4_ = fStack_34c;
              auVar82 = minps(auVar32,auVar252);
              auVar156 = minps(auVar156,auVar82);
              auVar82 = maxps(auVar32,auVar252);
              auVar82 = maxps(auVar265,auVar82);
              auVar164._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
              auVar164._8_4_ = auVar156._8_4_ & 0x7fffffff;
              auVar164._12_4_ = auVar156._12_4_ & 0x7fffffff;
              local_448 = auVar82._12_4_;
              auVar118._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar118._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar118._12_4_ = ABS(local_448);
              auVar82 = maxps(auVar164,auVar118);
              fVar153 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar153 = auVar82._0_4_;
              }
              auVar165._8_8_ = auVar82._8_8_;
              auVar165._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar153) {
                auVar165._0_4_ = fVar153;
              }
              fVar166 = auVar165._0_4_ * 1.9073486e-06;
              local_3f8._0_4_ =
                   SQRT(fVar123 * fVar123 + fVar122 * fVar122 + fVar81 * fVar81) * 1.9073486e-06;
              fStack_444 = local_448;
              fStack_440 = local_448;
              fStack_43c = local_448;
              fVar153 = local_118[lVar21];
              fVar154 = *(float *)(local_288 + lVar21 * 4);
              fVar168 = 0.0;
              fVar196 = 0.0;
              bVar74 = true;
              uVar68 = 0;
              do {
                fVar260 = 1.0 - fVar153;
                fVar272 = local_4b8 * fVar260 + local_358 * fVar153;
                fVar273 = fStack_4b4 * fVar260 + fStack_354 * fVar153;
                fVar310 = fStack_4b0 * fVar260 + fStack_350 * fVar153;
                fVar255 = fStack_4ac * fVar260 + fStack_34c * fVar153;
                fVar222 = ((float)local_578._0_4_ * fVar260 + local_4b8 * fVar153) * fVar260 +
                          fVar153 * fVar272;
                fVar223 = ((float)local_578._4_4_ * fVar260 + fStack_4b4 * fVar153) * fVar260 +
                          fVar153 * fVar273;
                fVar224 = (fStack_570 * fVar260 + fStack_4b0 * fVar153) * fVar260 +
                          fVar153 * fVar310;
                fVar254 = (fStack_56c * fVar260 + fStack_4ac * fVar153) * fVar260 +
                          fVar153 * fVar255;
                fVar272 = fVar272 * fVar260 +
                          (local_358 * fVar260 + auVar252._0_4_ * fVar153) * fVar153;
                fVar273 = fVar273 * fVar260 +
                          (fStack_354 * fVar260 + auVar252._4_4_ * fVar153) * fVar153;
                fVar258 = fVar310 * fVar260 +
                          (fStack_350 * fVar260 + auVar252._8_4_ * fVar153) * fVar153;
                fVar259 = fVar255 * fVar260 +
                          (fStack_34c * fVar260 + auVar252._12_4_ * fVar153) * fVar153;
                local_3a8 = fVar260 * fVar222 + fVar153 * fVar272;
                fStack_3a4 = fVar260 * fVar223 + fVar153 * fVar273;
                fStack_3a0 = fVar260 * fVar224 + fVar153 * fVar258;
                fStack_39c = fVar260 * fVar254 + fVar153 * fVar259;
                fVar310 = (fVar272 - fVar222) * 3.0;
                fVar255 = (fVar273 - fVar223) * 3.0;
                fVar258 = (fVar258 - fVar224) * 3.0;
                fVar259 = (fVar259 - fVar254) * 3.0;
                fVar254 = fVar260 * 6.0;
                fVar223 = (fVar153 - (fVar260 + fVar260)) * 6.0;
                fVar224 = (fVar260 - (fVar153 + fVar153)) * 6.0;
                fVar222 = fVar153 * 6.0;
                fVar260 = fVar254 * (float)local_578._0_4_ +
                          fVar223 * local_4b8 + fVar224 * local_358 + fVar222 * auVar252._0_4_;
                fVar272 = fVar254 * (float)local_578._4_4_ +
                          fVar223 * fStack_4b4 + fVar224 * fStack_354 + fVar222 * auVar252._4_4_;
                fVar273 = fVar254 * fStack_570 +
                          fVar223 * fStack_4b0 + fVar224 * fStack_350 + fVar222 * auVar252._8_4_;
                fVar222 = (fVar154 * fVar81 + 0.0) - local_3a8;
                fVar223 = (fVar154 * fVar122 + 0.0) - fStack_3a4;
                fVar224 = (fVar154 * fVar123 + 0.0) - fStack_3a0;
                fVar274 = (fVar154 * fVar152 + 0.0) - fStack_39c;
                fVar254 = fVar223 * fVar223;
                fStack_400 = fVar224 * fVar224;
                fStack_3fc = fVar274 * fVar274;
                local_408 = fVar254 + fVar222 * fVar222 + fStack_400;
                fStack_404 = fVar254 + fVar254 + fStack_3fc;
                fStack_400 = fVar254 + fStack_400 + fStack_400;
                fStack_3fc = fVar254 + fStack_3fc + fStack_3fc;
                uStack_5a4 = auVar165._4_4_;
                uStack_5a0 = auVar165._8_4_;
                uStack_59c = auVar165._12_4_;
                local_3e8._0_4_ = fVar166;
                if (fVar166 <= (float)local_3f8._0_4_ * fVar154) {
                  local_3e8._0_4_ = (float)local_3f8._0_4_ * fVar154;
                }
                fVar280 = fVar255 * fVar255 + fVar310 * fVar310 + fVar258 * fVar258;
                auVar82 = ZEXT416((uint)fVar280);
                auVar156 = rsqrtss(ZEXT416((uint)fVar280),auVar82);
                fVar254 = auVar156._0_4_;
                fVar283 = fVar254 * 1.5 - fVar254 * fVar254 * fVar280 * 0.5 * fVar254;
                fVar305 = fVar310 * fVar283;
                fVar306 = fVar255 * fVar283;
                fStack_3d0 = fVar258 * fVar283;
                local_3d8._4_4_ = fVar259 * fVar283;
                fVar298 = fVar258 * fVar273 + fVar255 * fVar272 + fVar310 * fVar260;
                auVar82 = rcpss(auVar82,auVar82);
                fVar254 = (2.0 - fVar280 * auVar82._0_4_) * auVar82._0_4_;
                fVar292 = fVar223 * fVar306;
                fVar294 = fVar224 * fStack_3d0;
                fVar296 = fVar274 * (float)local_3d8._4_4_;
                fVar279 = fVar292 + fVar222 * fVar305 + fVar294;
                fVar308 = fVar292 + fVar292 + fVar296;
                fVar294 = fVar292 + fVar294 + fVar294;
                fVar296 = fVar292 + fVar296 + fVar296;
                local_3e8._4_4_ = uStack_5a4;
                fStack_3e0 = (float)uStack_5a0;
                fStack_3dc = (float)uStack_59c;
                local_3b8 = (SQRT(local_408) + 1.0) * (fVar166 / SQRT(fVar280)) +
                            SQRT(local_408) * fVar166 + (float)local_3e8._0_4_;
                auVar235._0_4_ = fVar81 * fVar305;
                auVar235._4_4_ = fVar122 * fVar306;
                auVar235._8_4_ = fVar123 * fStack_3d0;
                auVar235._12_4_ = fVar152 * (float)local_3d8._4_4_;
                fStack_3d0 = fStack_3d0 * -fVar258;
                local_3d8._4_4_ = (float)local_3d8._4_4_ * -fVar259;
                local_3d8._0_4_ =
                     fStack_3d0 + fVar306 * -fVar255 + fVar305 * -fVar310 +
                     fVar254 * (fVar280 * fVar273 - fVar298 * fVar258) * fVar283 * fVar224 +
                     fVar254 * (fVar280 * fVar272 - fVar298 * fVar255) * fVar283 * fVar223 +
                     fVar254 * (fVar280 * fVar260 - fVar298 * fVar310) * fVar283 * fVar222;
                auVar236._8_8_ = auVar235._8_8_;
                auVar236._0_8_ = auVar236._8_8_;
                auVar237._4_12_ = auVar236._4_12_;
                auVar237._0_4_ = auVar235._8_4_ + auVar235._4_4_ + auVar235._0_4_;
                fVar272 = local_408 - fVar279 * fVar279;
                auVar304._0_8_ = CONCAT44(fStack_404 - fVar308 * fVar308,fVar272);
                auVar304._8_4_ = fStack_400 - fVar294 * fVar294;
                auVar304._12_4_ = fStack_3fc - fVar296 * fVar296;
                fStack_3c0 = -fVar258 * fVar224;
                fStack_3c4 = -fVar259 * fVar274;
                fStack_3cc = (float)local_3d8._4_4_;
                local_3c8 = (fStack_3c0 + -fVar255 * fVar223 + -fVar310 * fVar222) -
                            fVar279 * (float)local_3d8._0_4_;
                fStack_3bc = fStack_3c4;
                fVar260 = fVar152 * fVar274;
                fVar254 = (fVar123 * fVar224 + fVar122 * fVar223 + fVar81 * fVar222) -
                          fVar279 * auVar237._0_4_;
                auVar150._8_4_ = auVar304._8_4_;
                auVar150._0_8_ = auVar304._0_8_;
                auVar150._12_4_ = auVar304._12_4_;
                auVar82 = rsqrtss(auVar150,auVar304);
                fVar273 = auVar82._0_4_;
                fVar273 = fVar273 * 1.5 - fVar273 * fVar273 * fVar272 * 0.5 * fVar273;
                local_4c8 = fVar154;
                fStack_4c4 = fVar153;
                fStack_4c0 = fVar168;
                fStack_4bc = fVar196;
                if (fVar272 < 0.0) {
                  local_418._4_4_ = fVar223;
                  local_418._0_4_ = fVar222;
                  fStack_410 = fVar224;
                  fStack_40c = fVar274;
                  local_4d8._4_4_ = fVar260;
                  local_4d8._0_4_ = fVar254;
                  fStack_4d0 = fVar123 * fVar224;
                  fStack_4cc = fVar260;
                  _local_438 = auVar237;
                  local_428 = fVar279;
                  fStack_424 = fVar308;
                  fStack_420 = fVar294;
                  fStack_41c = fVar296;
                  fVar272 = sqrtf(fVar272);
                  fVar222 = (float)local_418._0_4_;
                  fVar223 = (float)local_418._4_4_;
                  fVar224 = fStack_410;
                  fVar254 = (float)local_4d8._0_4_;
                  fVar260 = (float)local_4d8._4_4_;
                  fVar279 = local_428;
                  auVar323 = local_438;
                }
                else {
                  fVar272 = SQRT(fVar272);
                  auVar323 = (undefined1  [8])auVar237._0_8_;
                }
                auVar252._4_4_ = fVar184;
                auVar252._0_4_ = fVar183;
                auVar252._8_4_ = fVar185;
                auVar252._12_4_ = fVar194;
                fVar272 = fVar272 - fStack_39c;
                fVar153 = local_3c8 * fVar273 - fVar259;
                fVar254 = fVar254 * fVar273;
                auVar221._0_8_ = local_3d8;
                auVar182._0_4_ = local_3d8._0_4_ * fVar254 - SUB84(auVar323,0) * fVar153;
                auVar192._8_4_ = -fStack_3c4;
                auVar192._0_8_ = CONCAT44(fStack_3c4,fVar153) ^ 0x8000000000000000;
                auVar192._12_4_ = fVar260;
                auVar191._8_8_ = auVar192._8_8_;
                auVar191._0_8_ = CONCAT44(fVar254,fVar153) ^ 0x80000000;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar82 = divps(auVar191,auVar182);
                auVar221._8_4_ = local_3d8._4_4_;
                auVar221._12_4_ = (uint)((ulong)auVar323 >> 0x20) ^ 0x80000000;
                auVar220._8_8_ = auVar221._8_8_;
                auVar220._0_8_ = CONCAT44(SUB84(auVar323,0),local_3d8._0_4_) ^ 0x8000000000000000;
                auVar156 = divps(auVar220,auVar182);
                fVar154 = local_4c8 - (fVar272 * auVar156._0_4_ + fVar279 * auVar82._0_4_);
                fVar153 = fStack_4c4 - (fVar272 * auVar156._4_4_ + fVar279 * auVar82._4_4_);
                fVar168 = fStack_4c0 - (fVar272 * auVar156._8_4_ + fVar279 * auVar82._8_4_);
                fVar196 = fStack_4bc - (fVar272 * auVar156._12_4_ + fVar279 * auVar82._12_4_);
                if ((ABS(fVar279) < local_3b8) &&
                   (ABS(fVar272) < local_448 * 1.9073486e-06 + (float)local_3e8._0_4_ + local_3b8))
                {
                  fVar154 = local_308._0_4_ + fVar154;
                  uVar64 = 0;
                  if ((fVar154 < (ray->org).field_0.m128[3]) ||
                     (((fVar81 = ray->tfar, fVar81 < fVar154 || (uVar64 = 0, fVar153 < 0.0)) ||
                      (1.0 < fVar153)))) goto LAB_00b1ce7e;
                  auVar30._4_4_ = fStack_404;
                  auVar30._0_4_ = local_408;
                  auVar30._8_4_ = fStack_400;
                  auVar30._12_4_ = fStack_3fc;
                  auVar82 = rsqrtss(auVar30,auVar30);
                  fVar122 = auVar82._0_4_;
                  pGVar16 = (context->scene->geometries).items[(long)pRVar67].ptr;
                  pRVar66 = pRVar67;
                  if ((pGVar16->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (uVar64 = CONCAT71((int7)((ulong)context->args >> 8),1),
                       pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b1ce7e;
                    fVar122 = fVar122 * 1.5 + fVar122 * fVar122 * local_408 * -0.5 * fVar122;
                    fVar222 = fVar222 * fVar122;
                    fVar223 = fVar223 * fVar122;
                    fVar224 = fVar224 * fVar122;
                    fVar122 = fVar259 * fVar222 + fVar310;
                    fVar123 = fVar259 * fVar223 + fVar255;
                    fVar152 = fVar259 * fVar224 + fVar258;
                    fVar166 = fVar223 * fVar310 - fVar255 * fVar222;
                    fVar168 = fVar224 * fVar255 - fVar258 * fVar223;
                    fVar196 = fVar222 * fVar258 - fVar310 * fVar224;
                    local_4a8 = CONCAT44(fVar122 * fVar166 - fVar168 * fVar152,
                                         fVar152 * fVar196 - fVar166 * fVar123);
                    fStack_4a0 = fVar123 * fVar168 - fVar196 * fVar122;
                    fStack_49c = fVar153;
                    local_498 = 0;
                    local_494 = (int)local_388;
                    local_490 = uVar75;
                    local_48c = context->user->instID[0];
                    pRVar66 = (RTCIntersectArguments *)(ulong)local_48c;
                    local_488 = context->user->instPrimID[0];
                    ray->tfar = fVar154;
                    local_53c = 0xffffffff;
                    local_538.geometryUserPtr = pGVar16->userPtr;
                    local_538.valid = &local_53c;
                    local_538.context = context->user;
                    local_538.hit = (RTCHitN *)&local_4a8;
                    local_538.N = 1;
                    local_538.ray = (RTCRayN *)ray;
                    if (pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b1d0a8:
                      pRVar66 = context->args;
                      p_Var63 = pRVar66->filter;
                      if ((p_Var63 != (RTCFilterFunctionN)0x0) &&
                         (((pRVar66->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var63)(&local_538);
                        p_Var63 = (RTCFilterFunctionN)local_538.valid;
                        if (*local_538.valid == 0) goto LAB_00b1d0ee;
                      }
                      uVar64 = CONCAT71((int7)((ulong)p_Var63 >> 8),1);
                      goto LAB_00b1ce7e;
                    }
                    (*pGVar16->occlusionFilterN)(&local_538);
                    if (*local_538.valid != 0) goto LAB_00b1d0a8;
LAB_00b1d0ee:
                    ray->tfar = fVar81;
                  }
                  uVar64 = 0;
                  goto LAB_00b1ce7e;
                }
                bVar74 = uVar68 < 4;
                uVar68 = uVar68 + 1;
              } while (uVar68 != 5);
              bVar74 = false;
              uVar64 = 5;
LAB_00b1ce7e:
              uVar59 = SUB84(pRVar66,0);
              fVar168 = ray->tfar;
              local_398._0_4_ = -(uint)(local_458 <= fVar168) & local_398._0_4_;
              local_398._4_4_ = -(uint)(fStack_454 <= fVar168) & local_398._4_4_;
              local_398._8_4_ = -(uint)(fStack_450 <= fVar168) & local_398._8_4_;
              local_398._12_4_ = -(uint)(fStack_44c <= fVar168) & local_398._12_4_;
              bVar71 = (bool)(bVar71 | bVar74 & (byte)uVar64);
              uVar65 = (undefined4)((ulong)uVar64 >> 0x20);
              iVar58 = movmskps((int)uVar64,local_398);
            } while (iVar58 != 0);
            iVar58 = 0;
            fVar238 = (float)local_298._0_4_;
            fVar239 = (float)local_298._4_4_;
            fVar240 = fStack_290;
            fVar253 = fStack_28c;
          }
          auVar193._0_4_ =
               local_4f8._0_4_ & local_328._0_4_ &
               -(uint)(local_4e8 + (float)local_138._0_4_ <= fVar168);
          auVar193._4_4_ =
               local_4f8._4_4_ & local_328._4_4_ &
               -(uint)(fStack_4e4 + (float)local_138._4_4_ <= fVar168);
          auVar193._8_4_ =
               (uint)fStack_4f0 & (uint)fStack_320 & -(uint)(fStack_4e0 + fStack_130 <= fVar168);
          auVar193._12_4_ =
               (uint)fStack_4ec & (uint)fStack_31c & -(uint)(fStack_4dc + fStack_12c <= fVar168);
          auVar119._0_4_ =
               auVar148._0_4_ & local_508._0_4_ & -(uint)(local_4e8 + fVar238 <= fVar168);
          auVar119._4_4_ =
               auVar148._4_4_ & local_508._4_4_ & -(uint)(fStack_4e4 + fVar239 <= fVar168);
          auVar119._8_4_ =
               auVar148._8_4_ & (uint)fStack_500 & -(uint)(fStack_4e0 + fVar240 <= fVar168);
          auVar119._12_4_ =
               auVar148._12_4_ & (uint)fStack_4fc & -(uint)(fStack_4dc + fVar253 <= fVar168);
          iVar58 = movmskps(iVar58,auVar119 | auVar193);
          if (iVar58 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar73 * 0x30) = auVar119 | auVar193;
            auStack_e8[uVar73 * 0xc] =
                 ~auVar193._0_4_ & (uint)fVar238 | local_138._0_4_ & auVar193._0_4_;
            auStack_e8[uVar73 * 0xc + 1] =
                 ~auVar193._4_4_ & (uint)fVar239 | local_138._4_4_ & auVar193._4_4_;
            auStack_e8[uVar73 * 0xc + 2] =
                 ~auVar193._8_4_ & (uint)fVar240 | (uint)fStack_130 & auVar193._8_4_;
            auStack_e8[uVar73 * 0xc + 3] =
                 ~auVar193._12_4_ & (uint)fVar253 | (uint)fStack_12c & auVar193._12_4_;
            (&uStack_d8)[uVar73 * 6] = CONCAT44(fStack_1e4,local_1e8);
            aiStack_d0[uVar73 * 0xc] = (int)fVar167 + 1;
            iVar72 = iVar72 + 1;
          }
        }
      }
    }
    fVar168 = fStack_35c;
    fVar166 = fStack_360;
    fVar154 = fStack_364;
    fVar153 = local_368;
    fVar152 = fStack_36c;
    fVar123 = fStack_370;
    fVar122 = fStack_374;
    fVar81 = local_378;
    fVar167 = ray->tfar;
    if (iVar72 == 0) break;
    uVar77 = -iVar72;
    pauVar61 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar72 - 1) * 0x30);
    uVar76 = uVar77;
    while( true ) {
      local_538.valid._0_4_ =
           -(uint)(local_4e8 + *(float *)pauVar61[1] <= fVar167) & *(uint *)*pauVar61;
      local_538.valid._4_4_ =
           -(uint)(fStack_4e4 + *(float *)(pauVar61[1] + 4) <= fVar167) & *(uint *)(*pauVar61 + 4);
      local_538.geometryUserPtr._0_4_ =
           -(uint)(fStack_4e0 + *(float *)(pauVar61[1] + 8) <= fVar167) & *(uint *)(*pauVar61 + 8);
      local_538.geometryUserPtr._4_4_ =
           -(uint)(fStack_4dc + *(float *)(pauVar61[1] + 0xc) <= fVar167) &
           *(uint *)(*pauVar61 + 0xc);
      iVar58 = movmskps(uVar76,(undefined1  [16])local_538._0_16_);
      if (iVar58 != 0) break;
      pauVar61 = pauVar61 + -3;
      uVar77 = uVar77 + 1;
      uVar76 = 0;
      if (uVar77 == 0) {
        uVar59 = 0;
        goto LAB_00b1d1bb;
      }
    }
    auVar161._0_4_ = (uint)*(float *)pauVar61[1] & (uint)local_538.valid;
    auVar161._4_4_ = (uint)*(float *)(pauVar61[1] + 4) & local_538.valid._4_4_;
    auVar161._8_4_ = (uint)*(float *)(pauVar61[1] + 8) & (uint)local_538.geometryUserPtr;
    auVar161._12_4_ = (uint)*(float *)(pauVar61[1] + 0xc) & local_538.geometryUserPtr._4_4_;
    auVar180._0_8_ = CONCAT44(~local_538.valid._4_4_,~(uint)local_538.valid) & 0x7f8000007f800000;
    auVar180._8_4_ = ~(uint)local_538.geometryUserPtr & 0x7f800000;
    auVar180._12_4_ = ~local_538.geometryUserPtr._4_4_ & 0x7f800000;
    auVar180 = auVar180 | auVar161;
    auVar162._4_4_ = auVar180._0_4_;
    auVar162._0_4_ = auVar180._4_4_;
    auVar162._8_4_ = auVar180._12_4_;
    auVar162._12_4_ = auVar180._8_4_;
    auVar82 = minps(auVar162,auVar180);
    auVar113._0_8_ = auVar82._8_8_;
    auVar113._8_4_ = auVar82._0_4_;
    auVar113._12_4_ = auVar82._4_4_;
    auVar82 = minps(auVar113,auVar82);
    auVar114._0_8_ =
         CONCAT44(-(uint)(auVar82._4_4_ == auVar180._4_4_) & local_538.valid._4_4_,
                  -(uint)(auVar82._0_4_ == auVar180._0_4_) & (uint)local_538.valid);
    auVar114._8_4_ = -(uint)(auVar82._8_4_ == auVar180._8_4_) & (uint)local_538.geometryUserPtr;
    auVar114._12_4_ = -(uint)(auVar82._12_4_ == auVar180._12_4_) & local_538.geometryUserPtr._4_4_;
    iVar58 = movmskps(iVar58,auVar114);
    auVar147 = (undefined1  [16])local_538._0_16_;
    if (iVar58 != 0) {
      auVar147._8_4_ = auVar114._8_4_;
      auVar147._0_8_ = auVar114._0_8_;
      auVar147._12_4_ = auVar114._12_4_;
    }
    uVar64 = *(undefined8 *)pauVar61[2];
    fVar167 = *(float *)(pauVar61[2] + 8);
    uVar76 = movmskps(iVar58,auVar147);
    pRVar66 = (RTCIntersectArguments *)0x0;
    if (uVar76 != 0) {
      for (; (uVar76 >> (long)pRVar66 & 1) == 0;
          pRVar66 = (RTCIntersectArguments *)((long)&pRVar66->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&local_538.valid + (long)pRVar66 * 4) = 0;
    *pauVar61 = (undefined1  [16])local_538._0_16_;
    iVar58 = movmskps((int)pauVar61,(undefined1  [16])local_538._0_16_);
    lVar62 = CONCAT44((int)((ulong)pauVar61 >> 0x20),iVar58);
    uVar76 = ~uVar77;
    if (iVar58 != 0) {
      uVar76 = -uVar77;
    }
    uVar73 = (ulong)uVar76;
    fVar196 = (float)uVar64;
    fVar222 = (float)((ulong)uVar64 >> 0x20) - fVar196;
    local_4a8 = CONCAT44(fVar222 * 0.33333334 + fVar196,fVar222 * 0.0 + fVar196);
    fStack_4a0 = fVar222 * 0.6666667 + fVar196;
    fStack_49c = fVar222 * 1.0 + fVar196;
    local_1e8 = *(float *)((long)&local_4a8 + (long)pRVar66 * 4);
    fStack_1e4 = *(float *)((long)&local_4a8 + (long)pRVar66 * 4 + 4);
  } while( true );
LAB_00b1d1bb:
  if (bVar71 != false) {
    return bVar71;
  }
  auVar151._4_4_ = -(uint)(fStack_274 <= fVar167);
  auVar151._0_4_ = -(uint)(local_278 <= fVar167);
  auVar151._8_4_ = -(uint)(fStack_270 <= fVar167);
  auVar151._12_4_ = -(uint)(fStack_26c <= fVar167);
  uVar75 = movmskps(uVar59,auVar151);
  uVar75 = (uint)local_2e0 - 1 & (uint)local_2e0 & uVar75;
  if (uVar75 == 0) {
    return false;
  }
  goto LAB_00b1ac0b;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }